

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  bool bVar55;
  undefined4 uVar56;
  undefined8 unaff_RBP;
  LinearSpace3fa *pLVar57;
  ulong uVar58;
  bool bVar59;
  float fVar60;
  float fVar61;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar62 [16];
  float fVar88;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  vint4 ai;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar146;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar163 [16];
  float fVar180;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar191;
  float fVar192;
  vfloat4 a0_3;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar185 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  undefined1 auVar190 [32];
  float fVar197;
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar227;
  __m128 a_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  __m128 a;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  vfloat4 a0_1;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar247;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar249 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  vfloat4 a0;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [32];
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p00;
  undefined1 local_568 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_528 [16];
  undefined1 (*local_518) [16];
  LinearSpace3fa *local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  uint local_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar281 [32];
  
  PVar3 = prim[1];
  uVar50 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar62._0_4_ = fVar60 * auVar9._0_4_;
  auVar62._4_4_ = fVar60 * auVar9._4_4_;
  auVar62._8_4_ = fVar60 * auVar9._8_4_;
  auVar62._12_4_ = fVar60 * auVar9._12_4_;
  auVar147._0_4_ = fVar60 * auVar10._0_4_;
  auVar147._4_4_ = fVar60 * auVar10._4_4_;
  auVar147._8_4_ = fVar60 * auVar10._8_4_;
  auVar147._12_4_ = fVar60 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xc + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x12 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x13 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x14 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar250._4_4_ = auVar147._0_4_;
  auVar250._0_4_ = auVar147._0_4_;
  auVar250._8_4_ = auVar147._0_4_;
  auVar250._12_4_ = auVar147._0_4_;
  auVar91 = vshufps_avx(auVar147,auVar147,0x55);
  auVar63 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar60 = auVar63._0_4_;
  auVar229._0_4_ = fVar60 * auVar12._0_4_;
  fVar84 = auVar63._4_4_;
  auVar229._4_4_ = fVar84 * auVar12._4_4_;
  fVar86 = auVar63._8_4_;
  auVar229._8_4_ = fVar86 * auVar12._8_4_;
  fVar88 = auVar63._12_4_;
  auVar229._12_4_ = fVar88 * auVar12._12_4_;
  auVar211._0_4_ = auVar15._0_4_ * fVar60;
  auVar211._4_4_ = auVar15._4_4_ * fVar84;
  auVar211._8_4_ = auVar15._8_4_ * fVar86;
  auVar211._12_4_ = auVar15._12_4_ * fVar88;
  auVar181._0_4_ = auVar111._0_4_ * fVar60;
  auVar181._4_4_ = auVar111._4_4_ * fVar84;
  auVar181._8_4_ = auVar111._8_4_ * fVar86;
  auVar181._12_4_ = auVar111._12_4_ * fVar88;
  auVar63 = vfmadd231ps_fma(auVar229,auVar91,auVar10);
  auVar92 = vfmadd231ps_fma(auVar211,auVar91,auVar14);
  auVar91 = vfmadd231ps_fma(auVar181,auVar64,auVar91);
  auVar124 = vfmadd231ps_fma(auVar63,auVar250,auVar9);
  auVar92 = vfmadd231ps_fma(auVar92,auVar250,auVar13);
  auVar137 = vfmadd231ps_fma(auVar91,auVar65,auVar250);
  auVar154._4_4_ = auVar62._0_4_;
  auVar154._0_4_ = auVar62._0_4_;
  auVar154._8_4_ = auVar62._0_4_;
  auVar154._12_4_ = auVar62._0_4_;
  auVar91 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar60 = auVar63._0_4_;
  auVar148._0_4_ = fVar60 * auVar12._0_4_;
  fVar84 = auVar63._4_4_;
  auVar148._4_4_ = fVar84 * auVar12._4_4_;
  fVar86 = auVar63._8_4_;
  auVar148._8_4_ = fVar86 * auVar12._8_4_;
  fVar88 = auVar63._12_4_;
  auVar148._12_4_ = fVar88 * auVar12._12_4_;
  auVar90._0_4_ = auVar15._0_4_ * fVar60;
  auVar90._4_4_ = auVar15._4_4_ * fVar84;
  auVar90._8_4_ = auVar15._8_4_ * fVar86;
  auVar90._12_4_ = auVar15._12_4_ * fVar88;
  auVar63._0_4_ = auVar111._0_4_ * fVar60;
  auVar63._4_4_ = auVar111._4_4_ * fVar84;
  auVar63._8_4_ = auVar111._8_4_ * fVar86;
  auVar63._12_4_ = auVar111._12_4_ * fVar88;
  auVar10 = vfmadd231ps_fma(auVar148,auVar91,auVar10);
  auVar12 = vfmadd231ps_fma(auVar90,auVar91,auVar14);
  auVar14 = vfmadd231ps_fma(auVar63,auVar91,auVar64);
  auVar15 = vfmadd231ps_fma(auVar10,auVar154,auVar9);
  auVar64 = vfmadd231ps_fma(auVar12,auVar154,auVar13);
  local_428._8_4_ = 0x7fffffff;
  local_428._0_8_ = 0x7fffffff7fffffff;
  local_428._12_4_ = 0x7fffffff;
  auVar111 = vfmadd231ps_fma(auVar14,auVar154,auVar65);
  auVar9 = vandps_avx(auVar124,local_428);
  auVar136._8_4_ = 0x219392ef;
  auVar136._0_8_ = 0x219392ef219392ef;
  auVar136._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar136,1);
  auVar10 = vblendvps_avx(auVar124,auVar136,auVar9);
  auVar9 = vandps_avx(auVar92,local_428);
  auVar9 = vcmpps_avx(auVar9,auVar136,1);
  auVar12 = vblendvps_avx(auVar92,auVar136,auVar9);
  auVar9 = vandps_avx(local_428,auVar137);
  auVar9 = vcmpps_avx(auVar9,auVar136,1);
  auVar9 = vblendvps_avx(auVar137,auVar136,auVar9);
  auVar13 = vrcpps_avx(auVar10);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = 0x3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar13,auVar182);
  auVar13 = vfmadd132ps_fma(auVar10,auVar13,auVar13);
  auVar10 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar182);
  auVar14 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar182);
  auVar65 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar9,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar137._0_4_ = auVar13._0_4_ * auVar12._0_4_;
  auVar137._4_4_ = auVar13._4_4_ * auVar12._4_4_;
  auVar137._8_4_ = auVar13._8_4_ * auVar12._8_4_;
  auVar137._12_4_ = auVar13._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar15);
  auVar149._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar149._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar149._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar149._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar50 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vsubps_avx(auVar9,auVar64);
  auVar92._1_3_ = 0;
  auVar92[0] = PVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar163._0_4_ = auVar14._0_4_ * auVar10._0_4_;
  auVar163._4_4_ = auVar14._4_4_ * auVar10._4_4_;
  auVar163._8_4_ = auVar14._8_4_ * auVar10._8_4_;
  auVar163._12_4_ = auVar14._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar91._0_4_ = auVar14._0_4_ * auVar9._0_4_;
  auVar91._4_4_ = auVar14._4_4_ * auVar9._4_4_;
  auVar91._8_4_ = auVar14._8_4_ * auVar9._8_4_;
  auVar91._12_4_ = auVar14._12_4_ * auVar9._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar50 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar111);
  auVar124._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar124._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar124._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar124._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar15);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar111);
  auVar64._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar137,auVar149);
  auVar10 = vpminsd_avx(auVar163,auVar91);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar124,auVar64);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar56;
  auVar212._0_4_ = uVar56;
  auVar212._8_4_ = uVar56;
  auVar212._12_4_ = uVar56;
  auVar10 = vmaxps_avx(auVar10,auVar212);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar198._0_4_ = auVar9._0_4_ * 0.99999964;
  auVar198._4_4_ = auVar9._4_4_ * 0.99999964;
  auVar198._8_4_ = auVar9._8_4_ * 0.99999964;
  auVar198._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar137,auVar149);
  auVar10 = vpmaxsd_avx(auVar163,auVar91);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar124,auVar64);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar111._4_4_ = uVar56;
  auVar111._0_4_ = uVar56;
  auVar111._8_4_ = uVar56;
  auVar111._12_4_ = uVar56;
  auVar10 = vminps_avx(auVar10,auVar111);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar65._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar92[4] = PVar3;
  auVar92._5_3_ = 0;
  auVar92[8] = PVar3;
  auVar92._9_3_ = 0;
  auVar92[0xc] = PVar3;
  auVar92._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar92,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(auVar198,auVar65,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar56 = vmovmskps_avx(auVar9);
  uVar50 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar56);
  pLVar57 = pre->ray_space + k;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_518 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_510 = pLVar57;
LAB_0115c95d:
  if (uVar50 == 0) {
LAB_0115e557:
    return uVar50 != 0;
  }
  lVar51 = 0;
  for (uVar58 = uVar50; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar51 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar49].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)uVar4 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar9 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar58);
  lVar51 = uVar58 + 1;
  auVar10 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar51);
  _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar58);
  auVar13 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar51);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar276._8_4_ = 0x3eaaaaab;
  auVar276._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar276._12_4_ = 0x3eaaaaab;
  auVar15 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar5[2].intersectionFilterN +
                             (long)pGVar5[2].pointQueryFunc * uVar58),auVar9,auVar276);
  auVar91 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              (long)pGVar5[2].pointQueryFunc * lVar51),auVar10,auVar276);
  auVar65 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar5[3].userPtr +
                             uVar58 * *(long *)&pGVar5[3].fnumTimeSegments),auVar12,auVar276);
  auVar63 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar5[3].userPtr +
                              *(long *)&pGVar5[3].fnumTimeSegments * lVar51),auVar13,auVar276);
  auVar66._12_4_ = 0;
  auVar66._0_12_ = ZEXT812(0);
  auVar66 = auVar66 << 0x20;
  auVar126._0_4_ = auVar10._0_4_ * 0.0;
  auVar126._4_4_ = auVar10._4_4_ * 0.0;
  auVar126._8_4_ = auVar10._8_4_ * 0.0;
  auVar126._12_4_ = auVar10._12_4_ * 0.0;
  auVar111 = vfmadd231ps_fma(auVar126,auVar91,auVar66);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar15,auVar111);
  local_668._0_4_ = auVar9._0_4_ + auVar64._0_4_;
  local_668._4_4_ = auVar9._4_4_ + auVar64._4_4_;
  fStack_660 = auVar9._8_4_ + auVar64._8_4_;
  fStack_65c = auVar9._12_4_ + auVar64._12_4_;
  auVar270._8_4_ = 0x40400000;
  auVar270._0_8_ = 0x4040000040400000;
  auVar270._12_4_ = 0x40400000;
  auVar64 = vfmadd231ps_fma(auVar111,auVar15,auVar270);
  auVar92 = vfnmadd231ps_fma(auVar64,auVar9,auVar270);
  auVar241._0_4_ = auVar13._0_4_ * 0.0;
  auVar241._4_4_ = auVar13._4_4_ * 0.0;
  auVar241._8_4_ = auVar13._8_4_ * 0.0;
  auVar241._12_4_ = auVar13._12_4_ * 0.0;
  auVar111 = vfmadd231ps_fma(auVar241,auVar63,auVar66);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar65,auVar111);
  auVar261._0_4_ = auVar12._0_4_ + auVar64._0_4_;
  auVar261._4_4_ = auVar12._4_4_ + auVar64._4_4_;
  auVar261._8_4_ = auVar12._8_4_ + auVar64._8_4_;
  auVar261._12_4_ = auVar12._12_4_ + auVar64._12_4_;
  auVar64 = vfmadd231ps_fma(auVar111,auVar65,auVar270);
  auVar111 = vfnmadd231ps_fma(auVar64,auVar12,auVar270);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar91,auVar10);
  auVar64 = vfmadd231ps_fma(auVar64,auVar15,auVar66);
  auVar64 = vfmadd231ps_fma(auVar64,auVar9,auVar66);
  auVar138._0_4_ = auVar10._0_4_ * 3.0;
  auVar138._4_4_ = auVar10._4_4_ * 3.0;
  auVar138._8_4_ = auVar10._8_4_ * 3.0;
  auVar138._12_4_ = auVar10._12_4_ * 3.0;
  auVar10 = vfnmadd231ps_fma(auVar138,auVar270,auVar91);
  auVar10 = vfmadd231ps_fma(auVar10,auVar66,auVar15);
  auVar91 = vfnmadd231ps_fma(auVar10,auVar66,auVar9);
  auVar9 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar63,auVar13);
  auVar9 = vfmadd231ps_fma(auVar9,auVar65,auVar66);
  auVar15 = vfmadd231ps_fma(auVar9,auVar12,auVar66);
  auVar183._0_4_ = auVar13._0_4_ * 3.0;
  auVar183._4_4_ = auVar13._4_4_ * 3.0;
  auVar183._8_4_ = auVar13._8_4_ * 3.0;
  auVar183._12_4_ = auVar13._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar183,auVar270,auVar63);
  auVar9 = vfmadd231ps_fma(auVar9,auVar66,auVar65);
  auVar65 = vfnmadd231ps_fma(auVar9,auVar66,auVar12);
  auVar9 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar10 = vshufps_avx(auVar261,auVar261,0xc9);
  fVar60 = auVar92._0_4_;
  auVar199._0_4_ = auVar10._0_4_ * fVar60;
  fVar86 = auVar92._4_4_;
  auVar199._4_4_ = auVar10._4_4_ * fVar86;
  fVar123 = auVar92._8_4_;
  auVar199._8_4_ = auVar10._8_4_ * fVar123;
  fVar87 = auVar92._12_4_;
  auVar199._12_4_ = auVar10._12_4_ * fVar87;
  auVar10 = vfmsub231ps_fma(auVar199,auVar9,auVar261);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar213._0_4_ = auVar10._0_4_ * fVar60;
  auVar213._4_4_ = auVar10._4_4_ * fVar86;
  auVar213._8_4_ = auVar10._8_4_ * fVar123;
  auVar213._12_4_ = auVar10._12_4_ * fVar87;
  auVar9 = vfmsub231ps_fma(auVar213,auVar9,auVar111);
  auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar10 = vshufps_avx(auVar15,auVar15,0xc9);
  fVar84 = auVar91._0_4_;
  auVar230._0_4_ = auVar10._0_4_ * fVar84;
  fVar88 = auVar91._4_4_;
  auVar230._4_4_ = auVar10._4_4_ * fVar88;
  fVar85 = auVar91._8_4_;
  auVar230._8_4_ = auVar10._8_4_ * fVar85;
  fVar146 = auVar91._12_4_;
  auVar230._12_4_ = auVar10._12_4_ * fVar146;
  auVar10 = vfmsub231ps_fma(auVar230,auVar9,auVar15);
  auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar231._0_4_ = auVar10._0_4_ * fVar84;
  auVar231._4_4_ = auVar10._4_4_ * fVar88;
  auVar231._8_4_ = auVar10._8_4_ * fVar85;
  auVar231._12_4_ = auVar10._12_4_ * fVar146;
  auVar10 = vfmsub231ps_fma(auVar231,auVar9,auVar65);
  auVar9 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar65 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar228 = auVar9._0_4_;
  auVar111 = ZEXT416((uint)fVar228);
  auVar10 = vrsqrtss_avx(auVar111,auVar111);
  fVar61 = auVar10._0_4_;
  auVar10 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar134 = fVar61 * 1.5 - fVar228 * 0.5 * fVar61 * fVar61 * fVar61;
  fVar162 = auVar12._0_4_ * fVar134;
  fVar178 = auVar12._4_4_ * fVar134;
  fVar179 = auVar12._8_4_ * fVar134;
  fVar180 = auVar12._12_4_ * fVar134;
  auVar214._0_4_ = fVar228 * auVar13._0_4_;
  auVar214._4_4_ = fVar228 * auVar13._4_4_;
  auVar214._8_4_ = fVar228 * auVar13._8_4_;
  auVar214._12_4_ = fVar228 * auVar13._12_4_;
  fVar61 = auVar10._0_4_;
  auVar200._0_4_ = fVar61 * auVar12._0_4_;
  auVar200._4_4_ = fVar61 * auVar12._4_4_;
  auVar200._8_4_ = fVar61 * auVar12._8_4_;
  auVar200._12_4_ = fVar61 * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar214,auVar200);
  auVar10 = vrcpss_avx(auVar111,auVar111);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar61 = auVar10._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar228 = auVar9._0_4_;
  auVar111 = ZEXT416((uint)fVar228);
  auVar10 = vrsqrtss_avx(auVar111,auVar111);
  fVar135 = auVar10._0_4_;
  fVar135 = fVar135 * 1.5 - fVar228 * 0.5 * fVar135 * fVar135 * fVar135;
  fVar247 = fVar135 * auVar15._0_4_;
  fVar258 = fVar135 * auVar15._4_4_;
  fVar259 = fVar135 * auVar15._8_4_;
  fVar260 = fVar135 * auVar15._12_4_;
  auVar10 = vdpps_avx(auVar15,auVar65,0x7f);
  auVar184._0_4_ = fVar228 * auVar65._0_4_;
  auVar184._4_4_ = fVar228 * auVar65._4_4_;
  auVar184._8_4_ = fVar228 * auVar65._8_4_;
  auVar184._12_4_ = fVar228 * auVar65._12_4_;
  fVar228 = auVar10._0_4_;
  auVar150._0_4_ = fVar228 * auVar15._0_4_;
  auVar150._4_4_ = fVar228 * auVar15._4_4_;
  auVar150._8_4_ = fVar228 * auVar15._8_4_;
  auVar150._12_4_ = fVar228 * auVar15._12_4_;
  auVar13 = vsubps_avx(auVar184,auVar150);
  auVar10 = vrcpss_avx(auVar111,auVar111);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar228 = auVar9._0_4_ * auVar10._0_4_;
  auVar9 = vshufps_avx(_local_668,_local_668,0xff);
  auVar215._0_4_ = auVar9._0_4_ * fVar162;
  auVar215._4_4_ = auVar9._4_4_ * fVar178;
  auVar215._8_4_ = auVar9._8_4_ * fVar179;
  auVar215._12_4_ = auVar9._12_4_ * fVar180;
  local_468 = vsubps_avx(_local_668,auVar215);
  auVar10 = vshufps_avx(auVar92,auVar92,0xff);
  auVar164._0_4_ = auVar10._0_4_ * fVar162 + fVar134 * auVar12._0_4_ * fVar61 * auVar9._0_4_;
  auVar164._4_4_ = auVar10._4_4_ * fVar178 + fVar134 * auVar12._4_4_ * fVar61 * auVar9._4_4_;
  auVar164._8_4_ = auVar10._8_4_ * fVar179 + fVar134 * auVar12._8_4_ * fVar61 * auVar9._8_4_;
  auVar164._12_4_ = auVar10._12_4_ * fVar180 + fVar134 * auVar12._12_4_ * fVar61 * auVar9._12_4_;
  auVar12 = vsubps_avx(auVar92,auVar164);
  local_478._0_4_ = auVar215._0_4_ + (float)local_668._0_4_;
  local_478._4_4_ = auVar215._4_4_ + (float)local_668._4_4_;
  fStack_470 = auVar215._8_4_ + fStack_660;
  fStack_46c = auVar215._12_4_ + fStack_65c;
  auVar9 = vshufps_avx(auVar64,auVar64,0xff);
  auVar112._0_4_ = fVar247 * auVar9._0_4_;
  auVar112._4_4_ = fVar258 * auVar9._4_4_;
  auVar112._8_4_ = fVar259 * auVar9._8_4_;
  auVar112._12_4_ = fVar260 * auVar9._12_4_;
  local_488 = vsubps_avx(auVar64,auVar112);
  auVar10 = vshufps_avx(auVar91,auVar91,0xff);
  auVar93._0_4_ = fVar247 * auVar10._0_4_ + auVar9._0_4_ * fVar135 * auVar13._0_4_ * fVar228;
  auVar93._4_4_ = fVar258 * auVar10._4_4_ + auVar9._4_4_ * fVar135 * auVar13._4_4_ * fVar228;
  auVar93._8_4_ = fVar259 * auVar10._8_4_ + auVar9._8_4_ * fVar135 * auVar13._8_4_ * fVar228;
  auVar93._12_4_ = fVar260 * auVar10._12_4_ + auVar9._12_4_ * fVar135 * auVar13._12_4_ * fVar228;
  auVar9 = vsubps_avx(auVar91,auVar93);
  fVar162 = auVar64._0_4_ + auVar112._0_4_;
  fVar178 = auVar64._4_4_ + auVar112._4_4_;
  fVar179 = auVar64._8_4_ + auVar112._8_4_;
  fVar180 = auVar64._12_4_ + auVar112._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar12._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar12._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar12._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar12._12_4_ * 0.33333334;
  auVar94._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar94._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar94._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar94._12_4_ = auVar9._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar94);
  local_448 = vsubps_avx(local_468,auVar14);
  auVar9 = vshufps_avx(local_448,local_448,0x55);
  auVar10 = vshufps_avx(local_448,local_448,0xaa);
  aVar2 = (pLVar57->vy).field_0;
  fVar61 = (pLVar57->vz).field_0.m128[0];
  fVar228 = *(float *)((long)&(pLVar57->vz).field_0 + 4);
  fVar134 = *(float *)((long)&(pLVar57->vz).field_0 + 8);
  fVar135 = *(float *)((long)&(pLVar57->vz).field_0 + 0xc);
  auVar95._0_4_ = fVar61 * auVar10._0_4_;
  auVar95._4_4_ = fVar228 * auVar10._4_4_;
  auVar95._8_4_ = fVar134 * auVar10._8_4_;
  auVar95._12_4_ = fVar135 * auVar10._12_4_;
  auVar12 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar9);
  local_458 = vsubps_avx(local_498,auVar14);
  auVar9 = vshufps_avx(local_458,local_458,0x55);
  auVar10 = vshufps_avx(local_458,local_458,0xaa);
  auVar277._0_4_ = fVar61 * auVar10._0_4_;
  auVar277._4_4_ = fVar228 * auVar10._4_4_;
  auVar277._8_4_ = fVar134 * auVar10._8_4_;
  auVar277._12_4_ = fVar135 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar2,auVar9);
  auVar64 = vsubps_avx(local_4a8,auVar14);
  auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar248._0_4_ = fVar61 * auVar9._0_4_;
  auVar248._4_4_ = fVar228 * auVar9._4_4_;
  auVar248._8_4_ = fVar134 * auVar9._8_4_;
  auVar248._12_4_ = fVar135 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar64,auVar64,0x55);
  auVar13 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar2,auVar9);
  auVar111 = vsubps_avx(local_488,auVar14);
  auVar9 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar262._0_4_ = fVar61 * auVar9._0_4_;
  auVar262._4_4_ = fVar228 * auVar9._4_4_;
  auVar262._8_4_ = fVar134 * auVar9._8_4_;
  auVar262._12_4_ = fVar135 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar111,auVar111,0x55);
  auVar15 = vfmadd231ps_fma(auVar262,(undefined1  [16])aVar2,auVar9);
  auVar91 = vsubps_avx(_local_478,auVar14);
  auVar9 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar151._0_4_ = fVar61 * auVar9._0_4_;
  auVar151._4_4_ = fVar228 * auVar9._4_4_;
  auVar151._8_4_ = fVar134 * auVar9._8_4_;
  auVar151._12_4_ = fVar135 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar91,auVar91,0x55);
  auVar65 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar9);
  local_4b8._0_4_ = (fVar60 + auVar164._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar86 + auVar164._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar123 + auVar164._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar87 + auVar164._12_4_) * 0.33333334 + fStack_46c;
  auVar63 = vsubps_avx(_local_4b8,auVar14);
  auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar201._0_4_ = auVar9._0_4_ * fVar61;
  auVar201._4_4_ = auVar9._4_4_ * fVar228;
  auVar201._8_4_ = auVar9._8_4_ * fVar134;
  auVar201._12_4_ = auVar9._12_4_ * fVar135;
  auVar9 = vshufps_avx(auVar63,auVar63,0x55);
  auVar137 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar9);
  auVar216._0_4_ = (fVar84 + auVar93._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar88 + auVar93._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar85 + auVar93._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar146 + auVar93._12_4_) * 0.33333334;
  auVar242._4_4_ = fVar178;
  auVar242._0_4_ = fVar162;
  auVar242._8_4_ = fVar179;
  auVar242._12_4_ = fVar180;
  _local_4c8 = vsubps_avx(auVar242,auVar216);
  auVar92 = vsubps_avx(_local_4c8,auVar14);
  auVar9 = vshufps_avx(auVar92,auVar92,0xaa);
  auVar217._0_4_ = auVar9._0_4_ * fVar61;
  auVar217._4_4_ = auVar9._4_4_ * fVar228;
  auVar217._8_4_ = auVar9._8_4_ * fVar134;
  auVar217._12_4_ = auVar9._12_4_ * fVar135;
  auVar9 = vshufps_avx(auVar92,auVar92,0x55);
  auVar62 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar9);
  auVar124 = vsubps_avx(auVar242,auVar14);
  auVar9 = vshufps_avx(auVar124,auVar124,0xaa);
  auVar67._0_4_ = fVar61 * auVar9._0_4_;
  auVar67._4_4_ = fVar228 * auVar9._4_4_;
  auVar67._8_4_ = fVar134 * auVar9._8_4_;
  auVar67._12_4_ = fVar135 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar124,auVar124,0x55);
  auVar9 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar9);
  auVar165._4_4_ = local_448._0_4_;
  auVar165._0_4_ = local_448._0_4_;
  auVar165._8_4_ = local_448._0_4_;
  auVar165._12_4_ = local_448._0_4_;
  aVar2 = (pLVar57->vx).field_0;
  auVar90 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar165);
  auVar166._4_4_ = local_458._0_4_;
  auVar166._0_4_ = local_458._0_4_;
  auVar166._8_4_ = local_458._0_4_;
  auVar166._12_4_ = local_458._0_4_;
  auVar136 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar166);
  uVar56 = auVar64._0_4_;
  auVar167._4_4_ = uVar56;
  auVar167._0_4_ = uVar56;
  auVar167._8_4_ = uVar56;
  auVar167._12_4_ = uVar56;
  auVar147 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar167);
  uVar56 = auVar111._0_4_;
  auVar168._4_4_ = uVar56;
  auVar168._0_4_ = uVar56;
  auVar168._8_4_ = uVar56;
  auVar168._12_4_ = uVar56;
  auVar148 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar168);
  uVar56 = auVar91._0_4_;
  auVar169._4_4_ = uVar56;
  auVar169._0_4_ = uVar56;
  auVar169._8_4_ = uVar56;
  auVar169._12_4_ = uVar56;
  auVar149 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar169);
  uVar56 = auVar63._0_4_;
  auVar170._4_4_ = uVar56;
  auVar170._0_4_ = uVar56;
  auVar170._8_4_ = uVar56;
  auVar170._12_4_ = uVar56;
  auVar163 = vfmadd231ps_fma(auVar137,(undefined1  [16])aVar2,auVar170);
  uVar56 = auVar92._0_4_;
  auVar171._4_4_ = uVar56;
  auVar171._0_4_ = uVar56;
  auVar171._8_4_ = uVar56;
  auVar171._12_4_ = uVar56;
  auVar181 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar171);
  uVar56 = auVar124._0_4_;
  auVar172._4_4_ = uVar56;
  auVar172._0_4_ = uVar56;
  auVar172._8_4_ = uVar56;
  auVar172._12_4_ = uVar56;
  auVar182 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar172);
  auVar13 = vmovlhps_avx(auVar90,auVar149);
  auVar14 = vmovlhps_avx(auVar136,auVar163);
  auVar15 = vmovlhps_avx(auVar147,auVar181);
  auVar65 = vmovlhps_avx(auVar148,auVar182);
  auVar9 = vminps_avx(auVar13,auVar14);
  auVar10 = vminps_avx(auVar15,auVar65);
  auVar12 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar13,auVar14);
  auVar10 = vmaxps_avx(auVar15,auVar65);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vshufpd_avx(auVar12,auVar12,3);
  auVar12 = vminps_avx(auVar12,auVar10);
  auVar10 = vshufpd_avx(auVar9,auVar9,3);
  auVar10 = vmaxps_avx(auVar9,auVar10);
  auVar9 = vandps_avx(local_428,auVar12);
  auVar10 = vandps_avx(local_428,auVar10);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  fVar84 = auVar9._0_4_ * 9.536743e-07;
  auVar185._8_8_ = auVar90._0_8_;
  auVar185._0_8_ = auVar90._0_8_;
  auVar232._8_8_ = auVar136._0_8_;
  auVar232._0_8_ = auVar136._0_8_;
  auVar249._0_8_ = auVar147._0_8_;
  auVar249._8_8_ = auVar249._0_8_;
  auVar263._0_8_ = auVar148._0_8_;
  auVar263._8_8_ = auVar263._0_8_;
  local_438 = 0x80000000;
  uStack_434 = 0x80000000;
  uStack_430 = 0x80000000;
  uStack_42c = 0x80000000;
  local_78 = fVar84;
  fStack_74 = fVar84;
  fStack_70 = fVar84;
  fStack_6c = fVar84;
  fStack_68 = fVar84;
  fStack_64 = fVar84;
  fStack_60 = fVar84;
  fStack_5c = fVar84;
  fStack_90 = -fVar84;
  local_98 = -fVar84;
  fStack_94 = -fVar84;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar55 = false;
  uVar58 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x30);
  auVar10 = vsubps_avx(auVar14,auVar13);
  auVar12 = vsubps_avx(auVar15,auVar14);
  auVar137 = vsubps_avx(auVar65,auVar15);
  auVar62 = vsubps_avx(_local_478,local_468);
  auVar90 = vsubps_avx(_local_4b8,local_498);
  auVar136 = vsubps_avx(_local_4c8,local_4a8);
  auVar22._4_4_ = fVar178;
  auVar22._0_4_ = fVar162;
  auVar22._8_4_ = fVar179;
  auVar22._12_4_ = fVar180;
  auVar147 = vsubps_avx(auVar22,local_488);
  auVar68 = ZEXT816(0x3f80000000000000);
  auVar9 = auVar68;
LAB_0115d0c3:
  auVar148 = vshufps_avx(auVar68,auVar68,0x50);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar281._16_4_ = 0x3f800000;
  auVar281._0_16_ = auVar278;
  auVar281._20_4_ = 0x3f800000;
  auVar281._24_4_ = 0x3f800000;
  auVar281._28_4_ = 0x3f800000;
  auVar211 = vsubps_avx(auVar278,auVar148);
  fVar86 = auVar148._0_4_;
  fVar135 = auVar149._0_4_;
  auVar69._0_4_ = fVar135 * fVar86;
  fVar88 = auVar148._4_4_;
  fVar247 = auVar149._4_4_;
  auVar69._4_4_ = fVar247 * fVar88;
  fVar123 = auVar148._8_4_;
  auVar69._8_4_ = fVar135 * fVar123;
  fVar85 = auVar148._12_4_;
  auVar69._12_4_ = fVar247 * fVar85;
  fVar258 = auVar163._0_4_;
  auVar173._0_4_ = fVar258 * fVar86;
  fVar259 = auVar163._4_4_;
  auVar173._4_4_ = fVar259 * fVar88;
  auVar173._8_4_ = fVar258 * fVar123;
  auVar173._12_4_ = fVar259 * fVar85;
  fVar197 = auVar181._0_4_;
  auVar139._0_4_ = fVar197 * fVar86;
  fVar209 = auVar181._4_4_;
  auVar139._4_4_ = fVar209 * fVar88;
  auVar139._8_4_ = fVar197 * fVar123;
  auVar139._12_4_ = fVar209 * fVar85;
  fVar210 = auVar182._0_4_;
  auVar113._0_4_ = fVar210 * fVar86;
  fVar227 = auVar182._4_4_;
  auVar113._4_4_ = fVar227 * fVar88;
  auVar113._8_4_ = fVar210 * fVar123;
  auVar113._12_4_ = fVar227 * fVar85;
  auVar250 = vfmadd231ps_fma(auVar69,auVar211,auVar185);
  auVar154 = vfmadd231ps_fma(auVar173,auVar211,auVar232);
  auVar66 = vfmadd231ps_fma(auVar139,auVar211,auVar249);
  auVar242 = vfmadd231ps_fma(auVar113,auVar263,auVar211);
  auVar148 = vmovshdup_avx(auVar9);
  fVar86 = auVar9._0_4_;
  fStack_140 = (auVar148._0_4_ - fVar86) * 0.04761905;
  auVar225._4_4_ = fVar86;
  auVar225._0_4_ = fVar86;
  auVar225._8_4_ = fVar86;
  auVar225._12_4_ = fVar86;
  auVar225._16_4_ = fVar86;
  auVar225._20_4_ = fVar86;
  auVar225._24_4_ = fVar86;
  auVar225._28_4_ = fVar86;
  auVar107._0_8_ = auVar148._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar81 = vsubps_avx(auVar107,auVar225);
  uVar56 = auVar250._0_4_;
  auVar274._4_4_ = uVar56;
  auVar274._0_4_ = uVar56;
  auVar274._8_4_ = uVar56;
  auVar274._12_4_ = uVar56;
  auVar274._16_4_ = uVar56;
  auVar274._20_4_ = uVar56;
  auVar274._24_4_ = uVar56;
  auVar274._28_4_ = uVar56;
  auVar148 = vmovshdup_avx(auVar250);
  uVar89 = auVar148._0_8_;
  auVar269._8_8_ = uVar89;
  auVar269._0_8_ = uVar89;
  auVar269._16_8_ = uVar89;
  auVar269._24_8_ = uVar89;
  fVar134 = auVar154._0_4_;
  auVar255._4_4_ = fVar134;
  auVar255._0_4_ = fVar134;
  auVar255._8_4_ = fVar134;
  auVar255._12_4_ = fVar134;
  auVar255._16_4_ = fVar134;
  auVar255._20_4_ = fVar134;
  auVar255._24_4_ = fVar134;
  auVar255._28_4_ = fVar134;
  auVar211 = vmovshdup_avx(auVar154);
  auVar108._0_8_ = auVar211._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  fVar228 = auVar66._0_4_;
  auVar188._4_4_ = fVar228;
  auVar188._0_4_ = fVar228;
  auVar188._8_4_ = fVar228;
  auVar188._12_4_ = fVar228;
  auVar188._16_4_ = fVar228;
  auVar188._20_4_ = fVar228;
  auVar188._24_4_ = fVar228;
  auVar188._28_4_ = fVar228;
  auVar212 = vmovshdup_avx(auVar66);
  auVar207._0_8_ = auVar212._0_8_;
  auVar207._8_8_ = auVar207._0_8_;
  auVar207._16_8_ = auVar207._0_8_;
  auVar207._24_8_ = auVar207._0_8_;
  fVar61 = auVar242._0_4_;
  auVar229 = vmovshdup_avx(auVar242);
  auVar22 = vfmadd132ps_fma(auVar81,auVar225,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar281,ZEXT1632(auVar22));
  fVar86 = auVar22._0_4_;
  fVar88 = auVar22._4_4_;
  auVar16._4_4_ = fVar134 * fVar88;
  auVar16._0_4_ = fVar134 * fVar86;
  fVar123 = auVar22._8_4_;
  auVar16._8_4_ = fVar134 * fVar123;
  fVar85 = auVar22._12_4_;
  auVar16._12_4_ = fVar134 * fVar85;
  auVar16._16_4_ = fVar134 * 0.0;
  auVar16._20_4_ = fVar134 * 0.0;
  auVar16._24_4_ = fVar134 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar22 = vfmadd231ps_fma(auVar16,auVar81,auVar274);
  fVar87 = auVar211._0_4_;
  fVar146 = auVar211._4_4_;
  auVar17._4_4_ = fVar146 * fVar88;
  auVar17._0_4_ = fVar87 * fVar86;
  auVar17._8_4_ = fVar87 * fVar123;
  auVar17._12_4_ = fVar146 * fVar85;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar146 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = uVar56;
  auVar67 = vfmadd231ps_fma(auVar17,auVar81,auVar269);
  auVar18._4_4_ = fVar228 * fVar88;
  auVar18._0_4_ = fVar228 * fVar86;
  auVar18._8_4_ = fVar228 * fVar123;
  auVar18._12_4_ = fVar228 * fVar85;
  auVar18._16_4_ = fVar228 * 0.0;
  auVar18._20_4_ = fVar228 * 0.0;
  auVar18._24_4_ = fVar228 * 0.0;
  auVar18._28_4_ = auVar148._4_4_;
  auVar126 = vfmadd231ps_fma(auVar18,auVar81,auVar255);
  fVar87 = auVar212._0_4_;
  fVar146 = auVar212._4_4_;
  auVar11._4_4_ = fVar146 * fVar88;
  auVar11._0_4_ = fVar87 * fVar86;
  auVar11._8_4_ = fVar87 * fVar123;
  auVar11._12_4_ = fVar146 * fVar85;
  auVar11._16_4_ = fVar87 * 0.0;
  auVar11._20_4_ = fVar146 * 0.0;
  auVar11._24_4_ = fVar87 * 0.0;
  auVar11._28_4_ = fVar134;
  auVar93 = vfmadd231ps_fma(auVar11,auVar81,auVar108);
  auVar148 = vshufps_avx(auVar250,auVar250,0xaa);
  local_568._8_8_ = auVar148._0_8_;
  local_568._0_8_ = local_568._8_8_;
  local_568._16_8_ = local_568._8_8_;
  local_568._24_8_ = local_568._8_8_;
  auVar211 = vshufps_avx(auVar250,auVar250,0xff);
  uStack_640 = auVar211._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar19._4_4_ = fVar61 * fVar88;
  auVar19._0_4_ = fVar61 * fVar86;
  auVar19._8_4_ = fVar61 * fVar123;
  auVar19._12_4_ = fVar61 * fVar85;
  auVar19._16_4_ = fVar61 * 0.0;
  auVar19._20_4_ = fVar61 * 0.0;
  auVar19._24_4_ = fVar61 * 0.0;
  auVar19._28_4_ = fVar61;
  auVar250 = vfmadd231ps_fma(auVar19,auVar81,auVar188);
  auVar211 = vshufps_avx(auVar154,auVar154,0xaa);
  auVar189._0_8_ = auVar211._0_8_;
  auVar189._8_8_ = auVar189._0_8_;
  auVar189._16_8_ = auVar189._0_8_;
  auVar189._24_8_ = auVar189._0_8_;
  auVar212 = vshufps_avx(auVar154,auVar154,0xff);
  local_4e8._8_8_ = auVar212._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar87 = auVar229._0_4_;
  fVar146 = auVar229._4_4_;
  auVar20._4_4_ = fVar146 * fVar88;
  auVar20._0_4_ = fVar87 * fVar86;
  auVar20._8_4_ = fVar87 * fVar123;
  auVar20._12_4_ = fVar146 * fVar85;
  auVar20._16_4_ = fVar87 * 0.0;
  auVar20._20_4_ = fVar146 * 0.0;
  auVar20._24_4_ = fVar87 * 0.0;
  auVar20._28_4_ = auVar148._4_4_;
  auVar94 = vfmadd231ps_fma(auVar20,auVar81,auVar207);
  auVar257._28_4_ = fVar146;
  auVar257._0_28_ =
       ZEXT1628(CONCAT412(auVar126._12_4_ * fVar85,
                          CONCAT48(auVar126._8_4_ * fVar123,
                                   CONCAT44(auVar126._4_4_ * fVar88,auVar126._0_4_ * fVar86))));
  auVar22 = vfmadd231ps_fma(auVar257,auVar81,ZEXT1632(auVar22));
  fVar87 = auVar212._4_4_;
  auVar23._28_4_ = fVar87;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(auVar93._12_4_ * fVar85,
                          CONCAT48(auVar93._8_4_ * fVar123,
                                   CONCAT44(auVar93._4_4_ * fVar88,auVar93._0_4_ * fVar86))));
  auVar67 = vfmadd231ps_fma(auVar23,auVar81,ZEXT1632(auVar67));
  auVar148 = vshufps_avx(auVar66,auVar66,0xaa);
  uVar89 = auVar148._0_8_;
  auVar177._8_8_ = uVar89;
  auVar177._0_8_ = uVar89;
  auVar177._16_8_ = uVar89;
  auVar177._24_8_ = uVar89;
  auVar229 = vshufps_avx(auVar66,auVar66,0xff);
  uVar89 = auVar229._0_8_;
  auVar282._8_8_ = uVar89;
  auVar282._0_8_ = uVar89;
  auVar282._16_8_ = uVar89;
  auVar282._24_8_ = uVar89;
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar250._12_4_ * fVar85,
                                               CONCAT48(auVar250._8_4_ * fVar123,
                                                        CONCAT44(auVar250._4_4_ * fVar88,
                                                                 auVar250._0_4_ * fVar86)))),auVar81
                            ,ZEXT1632(auVar126));
  auVar250 = vshufps_avx(auVar242,auVar242,0xaa);
  auVar154 = vshufps_avx(auVar242,auVar242,0xff);
  auVar242 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar94._12_4_,
                                                CONCAT48(fVar123 * auVar94._8_4_,
                                                         CONCAT44(fVar88 * auVar94._4_4_,
                                                                  fVar86 * auVar94._0_4_)))),auVar81
                             ,ZEXT1632(auVar93));
  auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar66._12_4_,
                                                CONCAT48(fVar123 * auVar66._8_4_,
                                                         CONCAT44(fVar88 * auVar66._4_4_,
                                                                  fVar86 * auVar66._0_4_)))),auVar81
                             ,ZEXT1632(auVar22));
  auVar16 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar22));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar242._12_4_,
                                               CONCAT48(fVar123 * auVar242._8_4_,
                                                        CONCAT44(fVar88 * auVar242._4_4_,
                                                                 fVar86 * auVar242._0_4_)))),auVar81
                            ,ZEXT1632(auVar67));
  auVar17 = vsubps_avx(ZEXT1632(auVar242),ZEXT1632(auVar67));
  fVar146 = auVar17._28_4_;
  auVar256._0_4_ = fStack_140 * auVar16._0_4_ * 3.0;
  auVar256._4_4_ = fStack_140 * auVar16._4_4_ * 3.0;
  auVar256._8_4_ = fStack_140 * auVar16._8_4_ * 3.0;
  auVar256._12_4_ = fStack_140 * auVar16._12_4_ * 3.0;
  auVar256._16_4_ = fStack_140 * auVar16._16_4_ * 3.0;
  auVar256._20_4_ = fStack_140 * auVar16._20_4_ * 3.0;
  auVar256._24_4_ = fStack_140 * auVar16._24_4_ * 3.0;
  auVar256._28_4_ = 0;
  local_418._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  local_418._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  fStack_410 = fStack_140 * auVar17._8_4_ * 3.0;
  fStack_40c = fStack_140 * auVar17._12_4_ * 3.0;
  fStack_408 = fStack_140 * auVar17._16_4_ * 3.0;
  fStack_404 = fStack_140 * auVar17._20_4_ * 3.0;
  fStack_400 = fStack_140 * auVar17._24_4_ * 3.0;
  fStack_3fc = fVar146;
  fVar61 = auVar211._0_4_;
  fVar228 = auVar211._4_4_;
  auVar24._4_4_ = fVar228 * fVar88;
  auVar24._0_4_ = fVar61 * fVar86;
  auVar24._8_4_ = fVar61 * fVar123;
  auVar24._12_4_ = fVar228 * fVar85;
  auVar24._16_4_ = fVar61 * 0.0;
  auVar24._20_4_ = fVar228 * 0.0;
  auVar24._24_4_ = fVar61 * 0.0;
  auVar24._28_4_ = fVar146;
  auVar211 = vfmadd231ps_fma(auVar24,auVar81,local_568);
  fVar61 = auVar212._0_4_;
  auVar25._4_4_ = fVar87 * fVar88;
  auVar25._0_4_ = fVar61 * fVar86;
  auVar25._8_4_ = fVar61 * fVar123;
  auVar25._12_4_ = fVar87 * fVar85;
  auVar25._16_4_ = fVar61 * 0.0;
  auVar25._20_4_ = fVar87 * 0.0;
  auVar25._24_4_ = fVar61 * 0.0;
  auVar25._28_4_ = 0;
  auVar212 = vfmadd231ps_fma(auVar25,auVar81,_local_648);
  fVar87 = auVar148._0_4_;
  fVar61 = auVar148._4_4_;
  auVar26._4_4_ = fVar61 * fVar88;
  auVar26._0_4_ = fVar87 * fVar86;
  auVar26._8_4_ = fVar87 * fVar123;
  auVar26._12_4_ = fVar61 * fVar85;
  auVar26._16_4_ = fVar87 * 0.0;
  auVar26._20_4_ = fVar61 * 0.0;
  auVar26._24_4_ = fVar87 * 0.0;
  auVar26._28_4_ = auVar16._28_4_;
  auVar148 = vfmadd231ps_fma(auVar26,auVar81,auVar189);
  fVar87 = auVar229._0_4_;
  fVar134 = auVar229._4_4_;
  auVar27._4_4_ = fVar134 * fVar88;
  auVar27._0_4_ = fVar87 * fVar86;
  auVar27._8_4_ = fVar87 * fVar123;
  auVar27._12_4_ = fVar134 * fVar85;
  auVar27._16_4_ = fVar87 * 0.0;
  auVar27._20_4_ = fVar134 * 0.0;
  auVar27._24_4_ = fVar87 * 0.0;
  auVar27._28_4_ = fVar228;
  auVar229 = vfmadd231ps_fma(auVar27,auVar81,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar126));
  fVar87 = auVar250._0_4_;
  fVar61 = auVar250._4_4_;
  auVar28._4_4_ = fVar61 * fVar88;
  auVar28._0_4_ = fVar87 * fVar86;
  auVar28._8_4_ = fVar87 * fVar123;
  auVar28._12_4_ = fVar61 * fVar85;
  auVar28._16_4_ = fVar87 * 0.0;
  auVar28._20_4_ = fVar61 * 0.0;
  auVar28._24_4_ = fVar87 * 0.0;
  auVar28._28_4_ = fVar61;
  auVar250 = vfmadd231ps_fma(auVar28,auVar81,auVar177);
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar66));
  fVar87 = auVar154._0_4_;
  fVar61 = auVar154._4_4_;
  auVar29._4_4_ = fVar61 * fVar88;
  auVar29._0_4_ = fVar87 * fVar86;
  auVar29._8_4_ = fVar87 * fVar123;
  auVar29._12_4_ = fVar61 * fVar85;
  auVar29._16_4_ = fVar87 * 0.0;
  auVar29._20_4_ = fVar61 * 0.0;
  auVar29._24_4_ = fVar87 * 0.0;
  auVar29._28_4_ = fVar61;
  auVar154 = vfmadd231ps_fma(auVar29,auVar81,auVar282);
  auVar30._28_4_ = fVar134;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar148._12_4_ * fVar85,
                          CONCAT48(auVar148._8_4_ * fVar123,
                                   CONCAT44(auVar148._4_4_ * fVar88,auVar148._0_4_ * fVar86))));
  auVar211 = vfmadd231ps_fma(auVar30,auVar81,ZEXT1632(auVar211));
  auVar212 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar229._12_4_,
                                                CONCAT48(fVar123 * auVar229._8_4_,
                                                         CONCAT44(fVar88 * auVar229._4_4_,
                                                                  fVar86 * auVar229._0_4_)))),
                             auVar81,ZEXT1632(auVar212));
  auVar109._0_4_ = auVar126._0_4_ + auVar256._0_4_;
  auVar109._4_4_ = auVar126._4_4_ + auVar256._4_4_;
  auVar109._8_4_ = auVar126._8_4_ + auVar256._8_4_;
  auVar109._12_4_ = auVar126._12_4_ + auVar256._12_4_;
  auVar109._16_4_ = auVar256._16_4_ + 0.0;
  auVar109._20_4_ = auVar256._20_4_ + 0.0;
  auVar109._24_4_ = auVar256._24_4_ + 0.0;
  auVar109._28_4_ = 0;
  auVar148 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar250._12_4_ * fVar85,
                                                CONCAT48(auVar250._8_4_ * fVar123,
                                                         CONCAT44(auVar250._4_4_ * fVar88,
                                                                  auVar250._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar148));
  auVar229 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar154._12_4_ * fVar85,
                                                CONCAT48(auVar154._8_4_ * fVar123,
                                                         CONCAT44(auVar154._4_4_ * fVar88,
                                                                  auVar154._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar229));
  auVar250 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar148._12_4_,
                                                CONCAT48(fVar123 * auVar148._8_4_,
                                                         CONCAT44(fVar88 * auVar148._4_4_,
                                                                  fVar86 * auVar148._0_4_)))),
                             auVar81,ZEXT1632(auVar211));
  auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar229._12_4_ * fVar85,
                                                CONCAT48(auVar229._8_4_ * fVar123,
                                                         CONCAT44(auVar229._4_4_ * fVar88,
                                                                  auVar229._0_4_ * fVar86)))),
                             ZEXT1632(auVar212),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar148),ZEXT1632(auVar211));
  auVar16 = vsubps_avx(ZEXT1632(auVar229),ZEXT1632(auVar212));
  auVar275._0_4_ = fStack_140 * auVar81._0_4_ * 3.0;
  auVar275._4_4_ = fStack_140 * auVar81._4_4_ * 3.0;
  auVar275._8_4_ = fStack_140 * auVar81._8_4_ * 3.0;
  auVar275._12_4_ = fStack_140 * auVar81._12_4_ * 3.0;
  auVar275._16_4_ = fStack_140 * auVar81._16_4_ * 3.0;
  auVar275._20_4_ = fStack_140 * auVar81._20_4_ * 3.0;
  auVar275._24_4_ = fStack_140 * auVar81._24_4_ * 3.0;
  auVar275._28_4_ = 0;
  local_158 = fStack_140 * auVar16._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar16._4_4_ * 3.0;
  auVar31._4_4_ = fStack_154;
  auVar31._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar16._8_4_ * 3.0;
  auVar31._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar16._12_4_ * 3.0;
  auVar31._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar16._16_4_ * 3.0;
  auVar31._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar16._20_4_ * 3.0;
  auVar31._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar16._24_4_ * 3.0;
  auVar31._24_4_ = fStack_140;
  auVar31._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar250));
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar154));
  auVar81 = vsubps_avx(ZEXT1632(auVar250),ZEXT1632(auVar126));
  auVar16 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar66));
  auVar17 = vsubps_avx(_local_508,local_4e8);
  fVar260 = auVar81._0_4_ + auVar17._0_4_;
  fVar191 = auVar81._4_4_ + auVar17._4_4_;
  fVar192 = auVar81._8_4_ + auVar17._8_4_;
  fVar193 = auVar81._12_4_ + auVar17._12_4_;
  fVar194 = auVar81._16_4_ + auVar17._16_4_;
  fVar195 = auVar81._20_4_ + auVar17._20_4_;
  fVar196 = auVar81._24_4_ + auVar17._24_4_;
  auVar18 = vsubps_avx(auVar20,auVar19);
  auVar82._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar82._4_4_ = auVar16._4_4_ + auVar18._4_4_;
  auVar82._8_4_ = auVar16._8_4_ + auVar18._8_4_;
  auVar82._12_4_ = auVar16._12_4_ + auVar18._12_4_;
  auVar82._16_4_ = auVar16._16_4_ + auVar18._16_4_;
  auVar82._20_4_ = auVar16._20_4_ + auVar18._20_4_;
  auVar82._24_4_ = auVar16._24_4_ + auVar18._24_4_;
  auVar82._28_4_ = auVar16._28_4_ + auVar18._28_4_;
  local_f8 = ZEXT1632(auVar66);
  fVar86 = auVar66._0_4_;
  local_178 = (float)local_418._0_4_ + fVar86;
  fVar88 = auVar66._4_4_;
  fStack_174 = (float)local_418._4_4_ + fVar88;
  fVar123 = auVar66._8_4_;
  fStack_170 = fStack_410 + fVar123;
  fVar85 = auVar66._12_4_;
  fStack_16c = fStack_40c + fVar85;
  fStack_168 = fStack_408 + 0.0;
  fStack_164 = fStack_404 + 0.0;
  fStack_160 = fStack_400 + 0.0;
  local_b8 = ZEXT1632(auVar126);
  auVar16 = vsubps_avx(local_b8,auVar256);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_f8,_local_418);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_118._0_4_ = auVar250._0_4_ + auVar275._0_4_;
  local_118._4_4_ = auVar250._4_4_ + auVar275._4_4_;
  local_118._8_4_ = auVar250._8_4_ + auVar275._8_4_;
  local_118._12_4_ = auVar250._12_4_ + auVar275._12_4_;
  local_118._16_4_ = auVar275._16_4_ + 0.0;
  local_118._20_4_ = auVar275._20_4_ + 0.0;
  local_118._24_4_ = auVar275._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar257 = ZEXT1632(auVar250);
  auVar16 = vsubps_avx(auVar257,auVar275);
  _local_418 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar87 = auVar154._0_4_;
  local_158 = fVar87 + local_158;
  fVar61 = auVar154._4_4_;
  fStack_154 = fVar61 + fStack_154;
  fVar228 = auVar154._8_4_;
  fStack_150 = fVar228 + fStack_150;
  fVar134 = auVar154._12_4_;
  fStack_14c = fVar134 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar154),auVar31);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar32._4_4_ = fVar88 * fVar191;
  auVar32._0_4_ = fVar86 * fVar260;
  auVar32._8_4_ = fVar123 * fVar192;
  auVar32._12_4_ = fVar85 * fVar193;
  auVar32._16_4_ = fVar194 * 0.0;
  auVar32._20_4_ = fVar195 * 0.0;
  auVar32._24_4_ = fVar196 * 0.0;
  auVar32._28_4_ = auVar16._28_4_;
  auVar148 = vfnmadd231ps_fma(auVar32,local_b8,auVar82);
  fStack_15c = fVar146 + 0.0;
  auVar33._4_4_ = fStack_174 * fVar191;
  auVar33._0_4_ = local_178 * fVar260;
  auVar33._8_4_ = fStack_170 * fVar192;
  auVar33._12_4_ = fStack_16c * fVar193;
  auVar33._16_4_ = fStack_168 * fVar194;
  auVar33._20_4_ = fStack_164 * fVar195;
  auVar33._24_4_ = fStack_160 * fVar196;
  auVar33._28_4_ = 0;
  auVar211 = vfnmadd231ps_fma(auVar33,auVar82,auVar109);
  auVar34._4_4_ = local_198._4_4_ * fVar191;
  auVar34._0_4_ = local_198._0_4_ * fVar260;
  auVar34._8_4_ = local_198._8_4_ * fVar192;
  auVar34._12_4_ = local_198._12_4_ * fVar193;
  auVar34._16_4_ = local_198._16_4_ * fVar194;
  auVar34._20_4_ = local_198._20_4_ * fVar195;
  auVar34._24_4_ = local_198._24_4_ * fVar196;
  auVar34._28_4_ = fVar146 + 0.0;
  auVar212 = vfnmadd231ps_fma(auVar34,local_d8,auVar82);
  local_648._0_4_ = auVar19._0_4_;
  local_648._4_4_ = auVar19._4_4_;
  uStack_640._0_4_ = auVar19._8_4_;
  uStack_640._4_4_ = auVar19._12_4_;
  uStack_638._0_4_ = auVar19._16_4_;
  uStack_638._4_4_ = auVar19._20_4_;
  uStack_630._0_4_ = auVar19._24_4_;
  uStack_630._4_4_ = auVar19._28_4_;
  auVar35._4_4_ = (float)local_648._4_4_ * fVar191;
  auVar35._0_4_ = (float)local_648._0_4_ * fVar260;
  auVar35._8_4_ = (float)uStack_640 * fVar192;
  auVar35._12_4_ = uStack_640._4_4_ * fVar193;
  auVar35._16_4_ = (float)uStack_638 * fVar194;
  auVar35._20_4_ = uStack_638._4_4_ * fVar195;
  auVar35._24_4_ = (float)uStack_630 * fVar196;
  auVar35._28_4_ = uStack_630._4_4_;
  auVar229 = vfnmadd231ps_fma(auVar35,local_4e8,auVar82);
  auVar208._0_4_ = fVar87 * fVar260;
  auVar208._4_4_ = fVar61 * fVar191;
  auVar208._8_4_ = fVar228 * fVar192;
  auVar208._12_4_ = fVar134 * fVar193;
  auVar208._16_4_ = fVar194 * 0.0;
  auVar208._20_4_ = fVar195 * 0.0;
  auVar208._24_4_ = fVar196 * 0.0;
  auVar208._28_4_ = 0;
  auVar250 = vfnmadd231ps_fma(auVar208,auVar257,auVar82);
  uStack_13c = 0x40400000;
  auVar36._4_4_ = fStack_154 * fVar191;
  auVar36._0_4_ = local_158 * fVar260;
  auVar36._8_4_ = fStack_150 * fVar192;
  auVar36._12_4_ = fStack_14c * fVar193;
  auVar36._16_4_ = fStack_148 * fVar194;
  auVar36._20_4_ = fStack_144 * fVar195;
  auVar36._24_4_ = fStack_140 * fVar196;
  auVar36._28_4_ = local_4e8._28_4_;
  auVar66 = vfnmadd231ps_fma(auVar36,local_118,auVar82);
  auVar37._4_4_ = local_138._4_4_ * fVar191;
  auVar37._0_4_ = local_138._0_4_ * fVar260;
  auVar37._8_4_ = local_138._8_4_ * fVar192;
  auVar37._12_4_ = local_138._12_4_ * fVar193;
  auVar37._16_4_ = local_138._16_4_ * fVar194;
  auVar37._20_4_ = local_138._20_4_ * fVar195;
  auVar37._24_4_ = local_138._24_4_ * fVar196;
  auVar37._28_4_ = local_138._28_4_;
  auVar242 = vfnmadd231ps_fma(auVar37,_local_418,auVar82);
  auVar38._4_4_ = auVar20._4_4_ * fVar191;
  auVar38._0_4_ = auVar20._0_4_ * fVar260;
  auVar38._8_4_ = auVar20._8_4_ * fVar192;
  auVar38._12_4_ = auVar20._12_4_ * fVar193;
  auVar38._16_4_ = auVar20._16_4_ * fVar194;
  auVar38._20_4_ = auVar20._20_4_ * fVar195;
  auVar38._24_4_ = auVar20._24_4_ * fVar196;
  auVar38._28_4_ = auVar81._28_4_ + auVar17._28_4_;
  auVar226 = ZEXT3264(_local_508);
  auVar22 = vfnmadd231ps_fma(auVar38,_local_508,auVar82);
  auVar16 = vminps_avx(ZEXT1632(auVar148),ZEXT1632(auVar211));
  auVar81 = vmaxps_avx(ZEXT1632(auVar148),ZEXT1632(auVar211));
  auVar17 = vminps_avx(ZEXT1632(auVar212),ZEXT1632(auVar229));
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(ZEXT1632(auVar212),ZEXT1632(auVar229));
  auVar81 = vmaxps_avx(auVar81,auVar16);
  auVar18 = vminps_avx(ZEXT1632(auVar250),ZEXT1632(auVar66));
  auVar16 = vmaxps_avx(ZEXT1632(auVar250),ZEXT1632(auVar66));
  auVar11 = vminps_avx(ZEXT1632(auVar242),ZEXT1632(auVar22));
  auVar18 = vminps_avx(auVar18,auVar11);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar242),ZEXT1632(auVar22));
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar81,auVar16);
  auVar47._4_4_ = fStack_74;
  auVar47._0_4_ = local_78;
  auVar47._8_4_ = fStack_70;
  auVar47._12_4_ = fStack_6c;
  auVar47._16_4_ = fStack_68;
  auVar47._20_4_ = fStack_64;
  auVar47._24_4_ = fStack_60;
  auVar47._28_4_ = fStack_5c;
  auVar81 = vcmpps_avx(auVar18,auVar47,2);
  auVar46._4_4_ = fStack_94;
  auVar46._0_4_ = local_98;
  auVar46._8_4_ = fStack_90;
  auVar46._12_4_ = fStack_8c;
  auVar46._16_4_ = fStack_88;
  auVar46._20_4_ = fStack_84;
  auVar46._24_4_ = fStack_80;
  auVar46._28_4_ = fStack_7c;
  auVar16 = vcmpps_avx(auVar16,auVar46,5);
  auVar81 = vandps_avx(auVar16,auVar81);
  auVar16 = local_1b8 & auVar81;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(local_4e8,local_b8);
    auVar17 = vsubps_avx(_local_508,auVar257);
    fVar260 = auVar16._0_4_ + auVar17._0_4_;
    fVar191 = auVar16._4_4_ + auVar17._4_4_;
    fVar192 = auVar16._8_4_ + auVar17._8_4_;
    fVar193 = auVar16._12_4_ + auVar17._12_4_;
    fVar194 = auVar16._16_4_ + auVar17._16_4_;
    fVar195 = auVar16._20_4_ + auVar17._20_4_;
    fVar196 = auVar16._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(auVar19,local_f8);
    auVar11 = vsubps_avx(auVar20,ZEXT1632(auVar154));
    auVar110._0_4_ = auVar18._0_4_ + auVar11._0_4_;
    auVar110._4_4_ = auVar18._4_4_ + auVar11._4_4_;
    auVar110._8_4_ = auVar18._8_4_ + auVar11._8_4_;
    auVar110._12_4_ = auVar18._12_4_ + auVar11._12_4_;
    auVar110._16_4_ = auVar18._16_4_ + auVar11._16_4_;
    auVar110._20_4_ = auVar18._20_4_ + auVar11._20_4_;
    auVar110._24_4_ = auVar18._24_4_ + auVar11._24_4_;
    fVar146 = auVar11._28_4_;
    auVar110._28_4_ = auVar18._28_4_ + fVar146;
    auVar39._4_4_ = fVar88 * fVar191;
    auVar39._0_4_ = fVar86 * fVar260;
    auVar39._8_4_ = fVar123 * fVar192;
    auVar39._12_4_ = fVar85 * fVar193;
    auVar39._16_4_ = fVar194 * 0.0;
    auVar39._20_4_ = fVar195 * 0.0;
    auVar39._24_4_ = fVar196 * 0.0;
    auVar39._28_4_ = auVar20._28_4_;
    auVar250 = vfnmadd231ps_fma(auVar39,auVar110,local_b8);
    auVar40._4_4_ = fVar191 * fStack_174;
    auVar40._0_4_ = fVar260 * local_178;
    auVar40._8_4_ = fVar192 * fStack_170;
    auVar40._12_4_ = fVar193 * fStack_16c;
    auVar40._16_4_ = fVar194 * fStack_168;
    auVar40._20_4_ = fVar195 * fStack_164;
    auVar40._24_4_ = fVar196 * fStack_160;
    auVar40._28_4_ = 0;
    auVar148 = vfnmadd213ps_fma(auVar109,auVar110,auVar40);
    auVar41._4_4_ = fVar191 * local_198._4_4_;
    auVar41._0_4_ = fVar260 * local_198._0_4_;
    auVar41._8_4_ = fVar192 * local_198._8_4_;
    auVar41._12_4_ = fVar193 * local_198._12_4_;
    auVar41._16_4_ = fVar194 * local_198._16_4_;
    auVar41._20_4_ = fVar195 * local_198._20_4_;
    auVar41._24_4_ = fVar196 * local_198._24_4_;
    auVar41._28_4_ = 0;
    auVar211 = vfnmadd213ps_fma(local_d8,auVar110,auVar41);
    auVar42._4_4_ = (float)local_648._4_4_ * fVar191;
    auVar42._0_4_ = (float)local_648._0_4_ * fVar260;
    auVar42._8_4_ = (float)uStack_640 * fVar192;
    auVar42._12_4_ = uStack_640._4_4_ * fVar193;
    auVar42._16_4_ = (float)uStack_638 * fVar194;
    auVar42._20_4_ = uStack_638._4_4_ * fVar195;
    auVar42._24_4_ = (float)uStack_630 * fVar196;
    auVar42._28_4_ = 0;
    auVar154 = vfnmadd231ps_fma(auVar42,auVar110,local_4e8);
    auVar132._0_4_ = fVar87 * fVar260;
    auVar132._4_4_ = fVar61 * fVar191;
    auVar132._8_4_ = fVar228 * fVar192;
    auVar132._12_4_ = fVar134 * fVar193;
    auVar132._16_4_ = fVar194 * 0.0;
    auVar132._20_4_ = fVar195 * 0.0;
    auVar132._24_4_ = fVar196 * 0.0;
    auVar132._28_4_ = 0;
    auVar66 = vfnmadd231ps_fma(auVar132,auVar110,auVar257);
    auVar43._4_4_ = fVar191 * fStack_154;
    auVar43._0_4_ = fVar260 * local_158;
    auVar43._8_4_ = fVar192 * fStack_150;
    auVar43._12_4_ = fVar193 * fStack_14c;
    auVar43._16_4_ = fVar194 * fStack_148;
    auVar43._20_4_ = fVar195 * fStack_144;
    auVar43._24_4_ = fVar196 * fStack_140;
    auVar43._28_4_ = fVar146;
    auVar212 = vfnmadd213ps_fma(local_118,auVar110,auVar43);
    auVar44._4_4_ = fVar191 * local_138._4_4_;
    auVar44._0_4_ = fVar260 * local_138._0_4_;
    auVar44._8_4_ = fVar192 * local_138._8_4_;
    auVar44._12_4_ = fVar193 * local_138._12_4_;
    auVar44._16_4_ = fVar194 * local_138._16_4_;
    auVar44._20_4_ = fVar195 * local_138._20_4_;
    auVar44._24_4_ = fVar196 * local_138._24_4_;
    auVar44._28_4_ = fVar146;
    auVar229 = vfnmadd213ps_fma(_local_418,auVar110,auVar44);
    auVar226 = ZEXT1664(auVar229);
    auVar45._4_4_ = fVar191 * auVar20._4_4_;
    auVar45._0_4_ = fVar260 * auVar20._0_4_;
    auVar45._8_4_ = fVar192 * auVar20._8_4_;
    auVar45._12_4_ = fVar193 * auVar20._12_4_;
    auVar45._16_4_ = fVar194 * auVar20._16_4_;
    auVar45._20_4_ = fVar195 * auVar20._20_4_;
    auVar45._24_4_ = fVar196 * auVar20._24_4_;
    auVar45._28_4_ = auVar16._28_4_ + auVar17._28_4_;
    auVar242 = vfnmadd231ps_fma(auVar45,auVar110,_local_508);
    auVar17 = vminps_avx(ZEXT1632(auVar250),ZEXT1632(auVar148));
    auVar16 = vmaxps_avx(ZEXT1632(auVar250),ZEXT1632(auVar148));
    auVar18 = vminps_avx(ZEXT1632(auVar211),ZEXT1632(auVar154));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar211),ZEXT1632(auVar154));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar11 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar212));
    auVar17 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar212));
    auVar19 = vminps_avx(ZEXT1632(auVar229),ZEXT1632(auVar242));
    auVar11 = vminps_avx(auVar11,auVar19);
    auVar11 = vminps_avx(auVar18,auVar11);
    auVar18 = vmaxps_avx(ZEXT1632(auVar229),ZEXT1632(auVar242));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar11,auVar47,2);
    auVar17 = vcmpps_avx(auVar17,auVar46,5);
    auVar16 = vandps_avx(auVar17,auVar16);
    auVar81 = vandps_avx(auVar81,local_1b8);
    auVar17 = auVar81 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar16,auVar81);
      uVar53 = vmovmskps_avx(auVar81);
      if (uVar53 != 0) {
        mask_stack[uVar58] = uVar53 & 0xff;
        BVar1 = (BBox1f)vmovlps_avx(auVar9);
        cu_stack[uVar58] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar68);
        cv_stack[uVar58] = BVar1;
        uVar58 = (ulong)((int)uVar58 + 1);
      }
    }
  }
LAB_0115d673:
  if ((int)uVar58 != 0) {
    uVar48 = (int)uVar58 - 1;
    uVar53 = mask_stack[uVar48];
    fVar86 = cu_stack[uVar48].lower;
    fVar88 = cu_stack[uVar48].upper;
    iVar21 = 0;
    for (uVar54 = (ulong)uVar53; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      iVar21 = iVar21 + 1;
    }
    uVar53 = uVar53 - 1 & uVar53;
    if (uVar53 == 0) {
      uVar58 = (ulong)uVar48;
    }
    auVar68._8_8_ = 0;
    auVar68._0_4_ = cv_stack[uVar48].lower;
    auVar68._4_4_ = cv_stack[uVar48].upper;
    mask_stack[uVar48] = uVar53;
    fVar123 = (float)(iVar21 + 1) * 0.14285715;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * (float)iVar21 * 0.14285715)),
                             ZEXT416((uint)fVar86),ZEXT416((uint)(1.0 - (float)iVar21 * 0.14285715))
                            );
    auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * fVar123)),ZEXT416((uint)fVar86),
                               ZEXT416((uint)(1.0 - fVar123)));
    fVar88 = auVar148._0_4_;
    auVar190._0_4_ = auVar9._0_4_;
    fVar86 = fVar88 - auVar190._0_4_;
    if (fVar86 < 0.16666667) {
      auVar211 = vshufps_avx(auVar68,auVar68,0x50);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar212 = vsubps_avx(auVar96,auVar211);
      fVar123 = auVar211._0_4_;
      auVar140._0_4_ = fVar123 * fVar135;
      fVar85 = auVar211._4_4_;
      auVar140._4_4_ = fVar85 * fVar247;
      fVar87 = auVar211._8_4_;
      auVar140._8_4_ = fVar87 * fVar135;
      fVar146 = auVar211._12_4_;
      auVar140._12_4_ = fVar146 * fVar247;
      auVar152._0_4_ = fVar123 * fVar258;
      auVar152._4_4_ = fVar85 * fVar259;
      auVar152._8_4_ = fVar87 * fVar258;
      auVar152._12_4_ = fVar146 * fVar259;
      auVar174._0_4_ = fVar123 * fVar197;
      auVar174._4_4_ = fVar85 * fVar209;
      auVar174._8_4_ = fVar87 * fVar197;
      auVar174._12_4_ = fVar146 * fVar209;
      auVar70._0_4_ = fVar123 * fVar210;
      auVar70._4_4_ = fVar85 * fVar227;
      auVar70._8_4_ = fVar87 * fVar210;
      auVar70._12_4_ = fVar146 * fVar227;
      auVar211 = vfmadd231ps_fma(auVar140,auVar212,auVar185);
      auVar229 = vfmadd231ps_fma(auVar152,auVar212,auVar232);
      auVar250 = vfmadd231ps_fma(auVar174,auVar212,auVar249);
      auVar212 = vfmadd231ps_fma(auVar70,auVar212,auVar263);
      auVar133._16_16_ = auVar211;
      auVar133._0_16_ = auVar211;
      auVar145._16_16_ = auVar229;
      auVar145._0_16_ = auVar229;
      auVar161._16_16_ = auVar250;
      auVar161._0_16_ = auVar250;
      auVar190._4_4_ = auVar190._0_4_;
      auVar190._8_4_ = auVar190._0_4_;
      auVar190._12_4_ = auVar190._0_4_;
      auVar190._20_4_ = fVar88;
      auVar190._16_4_ = fVar88;
      auVar190._24_4_ = fVar88;
      auVar190._28_4_ = fVar88;
      auVar81 = vsubps_avx(auVar145,auVar133);
      auVar229 = vfmadd213ps_fma(auVar81,auVar190,auVar133);
      auVar81 = vsubps_avx(auVar161,auVar145);
      auVar154 = vfmadd213ps_fma(auVar81,auVar190,auVar145);
      auVar211 = vsubps_avx(auVar212,auVar250);
      auVar83._16_16_ = auVar211;
      auVar83._0_16_ = auVar211;
      auVar211 = vfmadd213ps_fma(auVar83,auVar190,auVar161);
      auVar81 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar229));
      auVar212 = vfmadd213ps_fma(auVar81,auVar190,ZEXT1632(auVar229));
      auVar81 = vsubps_avx(ZEXT1632(auVar211),ZEXT1632(auVar154));
      auVar211 = vfmadd213ps_fma(auVar81,auVar190,ZEXT1632(auVar154));
      auVar81 = vsubps_avx(ZEXT1632(auVar211),ZEXT1632(auVar212));
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar81,auVar190);
      fVar228 = auVar81._4_4_ * 3.0;
      local_4e8._0_4_ = fVar86;
      fVar123 = fVar86 * 0.33333334;
      auVar97._0_8_ =
           CONCAT44(auVar22._4_4_ + fVar123 * fVar228,auVar22._0_4_ + fVar123 * auVar81._0_4_ * 3.0)
      ;
      auVar97._8_4_ = auVar22._8_4_ + fVar123 * auVar81._8_4_ * 3.0;
      auVar97._12_4_ = auVar22._12_4_ + fVar123 * auVar81._12_4_ * 3.0;
      auVar212 = vshufpd_avx(auVar22,auVar22,3);
      auVar229 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_508 = auVar212;
      auVar211 = vsubps_avx(auVar212,auVar22);
      auVar250 = vsubps_avx(auVar229,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar211._0_4_ + auVar250._0_4_;
      auVar71._4_4_ = auVar211._4_4_ + auVar250._4_4_;
      auVar71._8_4_ = auVar211._8_4_ + auVar250._8_4_;
      auVar71._12_4_ = auVar211._12_4_ + auVar250._12_4_;
      auVar211 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar250 = vshufps_avx(auVar97,auVar97,0xb1);
      auVar271._4_4_ = auVar71._0_4_;
      auVar271._0_4_ = auVar71._0_4_;
      auVar271._8_4_ = auVar71._0_4_;
      auVar271._12_4_ = auVar71._0_4_;
      auVar154 = vshufps_avx(auVar71,auVar71,0x55);
      fVar85 = auVar154._0_4_;
      auVar72._0_4_ = fVar85 * auVar211._0_4_;
      fVar87 = auVar154._4_4_;
      auVar72._4_4_ = fVar87 * auVar211._4_4_;
      fVar146 = auVar154._8_4_;
      auVar72._8_4_ = fVar146 * auVar211._8_4_;
      fVar61 = auVar154._12_4_;
      auVar72._12_4_ = fVar61 * auVar211._12_4_;
      auVar153._0_4_ = fVar85 * auVar250._0_4_;
      auVar153._4_4_ = fVar87 * auVar250._4_4_;
      auVar153._8_4_ = fVar146 * auVar250._8_4_;
      auVar153._12_4_ = fVar61 * auVar250._12_4_;
      auVar66 = vfmadd231ps_fma(auVar72,auVar271,auVar22);
      auVar242 = vfmadd231ps_fma(auVar153,auVar271,auVar97);
      auVar250 = vshufps_avx(auVar66,auVar66,0xe8);
      auVar154 = vshufps_avx(auVar242,auVar242,0xe8);
      auVar211 = vcmpps_avx(auVar250,auVar154,1);
      uVar53 = vextractps_avx(auVar211,0);
      auVar67 = auVar242;
      if ((uVar53 & 1) == 0) {
        auVar67 = auVar66;
      }
      auVar125._0_4_ = fVar123 * auVar81._16_4_ * 3.0;
      auVar125._4_4_ = fVar123 * fVar228;
      auVar125._8_4_ = fVar123 * auVar81._24_4_ * 3.0;
      auVar125._12_4_ = fVar123 * auVar226._28_4_;
      auVar95 = vsubps_avx((undefined1  [16])0x0,auVar125);
      auVar126 = vshufps_avx(auVar95,auVar95,0xb1);
      auVar93 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar186._0_4_ = fVar85 * auVar126._0_4_;
      auVar186._4_4_ = fVar87 * auVar126._4_4_;
      auVar186._8_4_ = fVar146 * auVar126._8_4_;
      auVar186._12_4_ = fVar61 * auVar126._12_4_;
      auVar202._0_4_ = auVar93._0_4_ * fVar85;
      auVar202._4_4_ = auVar93._4_4_ * fVar87;
      auVar202._8_4_ = auVar93._8_4_ * fVar146;
      auVar202._12_4_ = auVar93._12_4_ * fVar61;
      _local_418 = auVar95;
      auVar112 = vfmadd231ps_fma(auVar186,auVar271,auVar95);
      auVar138 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar271);
      auVar93 = vshufps_avx(auVar112,auVar112,0xe8);
      auVar94 = vshufps_avx(auVar138,auVar138,0xe8);
      auVar226 = ZEXT1664(auVar94);
      auVar126 = vcmpps_avx(auVar93,auVar94,1);
      uVar53 = vextractps_avx(auVar126,0);
      auVar150 = auVar138;
      if ((uVar53 & 1) == 0) {
        auVar150 = auVar112;
      }
      auVar67 = vmaxss_avx(auVar150,auVar67);
      auVar250 = vminps_avx(auVar250,auVar154);
      auVar154 = vminps_avx(auVar93,auVar94);
      auVar154 = vminps_avx(auVar250,auVar154);
      auVar211 = vshufps_avx(auVar211,auVar211,0x55);
      auVar211 = vblendps_avx(auVar211,auVar126,2);
      auVar126 = vpslld_avx(auVar211,0x1f);
      auVar211 = vshufpd_avx(auVar242,auVar242,1);
      auVar211 = vinsertps_avx(auVar211,auVar138,0x9c);
      auVar250 = vshufpd_avx(auVar66,auVar66,1);
      auVar250 = vinsertps_avx(auVar250,auVar112,0x9c);
      auVar211 = vblendvps_avx(auVar250,auVar211,auVar126);
      auVar250 = vmovshdup_avx(auVar211);
      auVar211 = vmaxss_avx(auVar250,auVar211);
      fVar146 = auVar154._0_4_;
      auVar250 = vmovshdup_avx(auVar154);
      fVar87 = auVar211._0_4_;
      fVar123 = auVar250._0_4_;
      fVar85 = auVar67._0_4_;
      if (((0.0001 <= fVar146) || (fVar87 <= -0.0001)) && (0.0001 <= fVar123 || fVar87 <= -0.0001))
      goto code_r0x0115d983;
      goto LAB_0115d9aa;
    }
    auVar9 = vinsertps_avx(auVar9,auVar148,0x10);
    goto LAB_0115d0c3;
  }
  if (bVar55) goto LAB_0115e557;
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar56;
  auVar80._0_4_ = uVar56;
  auVar80._8_4_ = uVar56;
  auVar80._12_4_ = uVar56;
  auVar9 = vcmpps_avx(auVar198,auVar80,2);
  uVar49 = vmovmskps_avx(auVar9);
  uVar50 = (ulong)((uint)uVar50 & (uint)uVar50 + 0xf & uVar49);
  goto LAB_0115c95d;
code_r0x0115d983:
  auVar250 = vcmpps_avx(auVar250,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar66 = vcmpps_avx(auVar154,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar250 = vandps_avx(auVar66,auVar250);
  if (fVar85 <= -0.0001 || (auVar250 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0115d673;
LAB_0115d9aa:
  auVar66 = vcmpps_avx(auVar154,_DAT_01f45a50,1);
  auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar250 = vcmpss_avx(auVar67,ZEXT816(0) << 0x20,1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar250 = vblendvps_avx(auVar98,auVar114,auVar250);
  auVar66 = vblendvps_avx(auVar98,auVar114,auVar66);
  fVar228 = auVar66._0_4_;
  fVar61 = auVar250._0_4_;
  auVar250 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar228 == fVar61) && (!NAN(fVar228) && !NAN(fVar61))) {
    auVar250 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar228 == fVar61) && (!NAN(fVar228) && !NAN(fVar61))) {
    auVar242 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar66 = vmovshdup_avx(auVar66);
  fVar134 = auVar66._0_4_;
  if ((fVar228 != fVar134) || (NAN(fVar228) || NAN(fVar134))) {
    if ((fVar123 != fVar146) || (NAN(fVar123) || NAN(fVar146))) {
      auVar127._0_4_ = (float)((uint)fVar146 ^ local_438);
      auVar127._4_4_ = auVar154._4_4_ ^ uStack_434;
      auVar127._8_4_ = auVar154._8_4_ ^ uStack_430;
      auVar127._12_4_ = auVar154._12_4_ ^ uStack_42c;
      auVar128._0_4_ = auVar127._0_4_ / (fVar123 - fVar146);
      auVar128._4_12_ = auVar127._4_12_;
      auVar154 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar66 = auVar154;
    }
    else {
      auVar154 = ZEXT816(0) << 0x20;
      if ((fVar146 != 0.0) || (auVar66 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar146))) {
        auVar154 = SUB6416(ZEXT464(0x7f800000),0);
        auVar66 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar250 = vminss_avx(auVar250,auVar154);
    auVar242 = vmaxss_avx(auVar66,auVar242);
  }
  auVar211 = vcmpss_avx(auVar211,ZEXT416(0),1);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar211 = vblendvps_avx(auVar99,auVar115,auVar211);
  fVar123 = auVar211._0_4_;
  if ((fVar61 != fVar123) || (NAN(fVar61) || NAN(fVar123))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar73._0_4_ = (float)((uint)fVar85 ^ local_438);
      auVar73._4_4_ = auVar67._4_4_ ^ uStack_434;
      auVar73._8_4_ = auVar67._8_4_ ^ uStack_430;
      auVar73._12_4_ = auVar67._12_4_ ^ uStack_42c;
      auVar129._0_4_ = auVar73._0_4_ / (fVar87 - fVar85);
      auVar129._4_12_ = auVar73._4_12_;
      auVar211 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar129,ZEXT416(0));
      auVar154 = auVar211;
    }
    else {
      auVar211 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar154 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar211 = SUB6416(ZEXT464(0xff800000),0);
        auVar154 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar250 = vminss_avx(auVar250,auVar154);
    auVar242 = vmaxss_avx(auVar211,auVar242);
  }
  if ((fVar134 != fVar123) || (NAN(fVar134) || NAN(fVar123))) {
    auVar250 = vminss_avx(auVar250,SUB6416(ZEXT464(0x3f800000),0));
    auVar242 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar242);
  }
  auVar211 = vmaxss_avx(ZEXT816(0) << 0x40,auVar250);
  auVar250 = vminss_avx(auVar242,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar250._0_4_ < auVar211._0_4_) goto LAB_0115d673;
  auVar211 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar211._0_4_ + -0.1)));
  auVar250 = vminss_avx(ZEXT416((uint)(auVar250._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar141._0_8_ = auVar22._0_8_;
  auVar141._8_8_ = auVar141._0_8_;
  auVar218._8_8_ = auVar97._0_8_;
  auVar218._0_8_ = auVar97._0_8_;
  auVar233._8_8_ = auVar95._0_8_;
  auVar233._0_8_ = auVar95._0_8_;
  auVar154 = vshufpd_avx(auVar97,auVar97,3);
  auVar66 = vshufpd_avx(auVar95,auVar95,3);
  auVar242 = vshufps_avx(auVar211,auVar250,0);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar74,auVar242);
  local_508._0_4_ = auVar212._0_4_;
  local_508._4_4_ = auVar212._4_4_;
  fStack_500 = auVar212._8_4_;
  fStack_4fc = auVar212._12_4_;
  fVar123 = auVar242._0_4_;
  auVar75._0_4_ = fVar123 * (float)local_508._0_4_;
  fVar85 = auVar242._4_4_;
  auVar75._4_4_ = fVar85 * (float)local_508._4_4_;
  fVar87 = auVar242._8_4_;
  auVar75._8_4_ = fVar87 * fStack_500;
  fVar146 = auVar242._12_4_;
  auVar75._12_4_ = fVar146 * fStack_4fc;
  auVar175._0_4_ = fVar123 * auVar154._0_4_;
  auVar175._4_4_ = fVar85 * auVar154._4_4_;
  auVar175._8_4_ = fVar87 * auVar154._8_4_;
  auVar175._12_4_ = fVar146 * auVar154._12_4_;
  auVar187._0_4_ = fVar123 * auVar66._0_4_;
  auVar187._4_4_ = fVar85 * auVar66._4_4_;
  auVar187._8_4_ = fVar87 * auVar66._8_4_;
  auVar187._12_4_ = fVar146 * auVar66._12_4_;
  auVar203._0_4_ = fVar123 * auVar229._0_4_;
  auVar203._4_4_ = fVar85 * auVar229._4_4_;
  auVar203._8_4_ = fVar87 * auVar229._8_4_;
  auVar203._12_4_ = fVar146 * auVar229._12_4_;
  auVar154 = vfmadd231ps_fma(auVar75,auVar22,auVar141);
  auVar66 = vfmadd231ps_fma(auVar175,auVar22,auVar218);
  auVar242 = vfmadd231ps_fma(auVar187,auVar22,auVar233);
  auVar22 = vfmadd231ps_fma(auVar203,auVar22,ZEXT816(0));
  auVar212 = vmovshdup_avx(auVar68);
  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ * auVar211._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar211._0_4_)));
  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ * auVar250._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar250._0_4_)));
  fVar123 = 1.0 / fVar86;
  auVar211 = vsubps_avx(auVar66,auVar154);
  auVar219._0_4_ = auVar211._0_4_ * 3.0;
  auVar219._4_4_ = auVar211._4_4_ * 3.0;
  auVar219._8_4_ = auVar211._8_4_ * 3.0;
  auVar219._12_4_ = auVar211._12_4_ * 3.0;
  auVar211 = vsubps_avx(auVar242,auVar66);
  auVar234._0_4_ = auVar211._0_4_ * 3.0;
  auVar234._4_4_ = auVar211._4_4_ * 3.0;
  auVar234._8_4_ = auVar211._8_4_ * 3.0;
  auVar234._12_4_ = auVar211._12_4_ * 3.0;
  auVar211 = vsubps_avx(auVar22,auVar242);
  auVar243._0_4_ = auVar211._0_4_ * 3.0;
  auVar243._4_4_ = auVar211._4_4_ * 3.0;
  auVar243._8_4_ = auVar211._8_4_ * 3.0;
  auVar243._12_4_ = auVar211._12_4_ * 3.0;
  auVar212 = vminps_avx(auVar234,auVar243);
  auVar211 = vmaxps_avx(auVar234,auVar243);
  auVar212 = vminps_avx(auVar219,auVar212);
  auVar211 = vmaxps_avx(auVar219,auVar211);
  auVar229 = vshufpd_avx(auVar212,auVar212,3);
  auVar250 = vshufpd_avx(auVar211,auVar211,3);
  auVar212 = vminps_avx(auVar212,auVar229);
  auVar211 = vmaxps_avx(auVar211,auVar250);
  auVar235._0_4_ = auVar212._0_4_ * fVar123;
  auVar235._4_4_ = auVar212._4_4_ * fVar123;
  auVar235._8_4_ = auVar212._8_4_ * fVar123;
  auVar235._12_4_ = auVar212._12_4_ * fVar123;
  auVar220._0_4_ = auVar211._0_4_ * fVar123;
  auVar220._4_4_ = auVar211._4_4_ * fVar123;
  auVar220._8_4_ = auVar211._8_4_ * fVar123;
  auVar220._12_4_ = auVar211._12_4_ * fVar123;
  fVar123 = 1.0 / (auVar95._0_4_ - auVar94._0_4_);
  auVar211 = vshufpd_avx(auVar154,auVar154,3);
  auVar212 = vshufpd_avx(auVar66,auVar66,3);
  auVar229 = vshufpd_avx(auVar242,auVar242,3);
  auVar250 = vshufpd_avx(auVar22,auVar22,3);
  auVar211 = vsubps_avx(auVar211,auVar154);
  auVar154 = vsubps_avx(auVar212,auVar66);
  auVar68 = vsubps_avx(auVar229,auVar242);
  auVar250 = vsubps_avx(auVar250,auVar22);
  auVar212 = vminps_avx(auVar211,auVar154);
  auVar211 = vmaxps_avx(auVar211,auVar154);
  auVar229 = vminps_avx(auVar68,auVar250);
  auVar229 = vminps_avx(auVar212,auVar229);
  auVar212 = vmaxps_avx(auVar68,auVar250);
  auVar211 = vmaxps_avx(auVar211,auVar212);
  auVar264._0_4_ = fVar123 * auVar229._0_4_;
  auVar264._4_4_ = fVar123 * auVar229._4_4_;
  auVar264._8_4_ = fVar123 * auVar229._8_4_;
  auVar264._12_4_ = fVar123 * auVar229._12_4_;
  auVar251._0_4_ = fVar123 * auVar211._0_4_;
  auVar251._4_4_ = fVar123 * auVar211._4_4_;
  auVar251._8_4_ = fVar123 * auVar211._8_4_;
  auVar251._12_4_ = fVar123 * auVar211._12_4_;
  auVar250 = vinsertps_avx(auVar9,auVar94,0x10);
  auVar154 = vinsertps_avx(auVar148,auVar95,0x10);
  auVar244._0_4_ = (auVar250._0_4_ + auVar154._0_4_) * 0.5;
  auVar244._4_4_ = (auVar250._4_4_ + auVar154._4_4_) * 0.5;
  auVar244._8_4_ = (auVar250._8_4_ + auVar154._8_4_) * 0.5;
  auVar244._12_4_ = (auVar250._12_4_ + auVar154._12_4_) * 0.5;
  auVar76._4_4_ = auVar244._0_4_;
  auVar76._0_4_ = auVar244._0_4_;
  auVar76._8_4_ = auVar244._0_4_;
  auVar76._12_4_ = auVar244._0_4_;
  auVar211 = vfmadd213ps_fma(auVar10,auVar76,auVar13);
  auVar212 = vfmadd213ps_fma(auVar12,auVar76,auVar14);
  auVar229 = vfmadd213ps_fma(auVar137,auVar76,auVar15);
  auVar148 = vsubps_avx(auVar212,auVar211);
  auVar211 = vfmadd213ps_fma(auVar148,auVar76,auVar211);
  auVar148 = vsubps_avx(auVar229,auVar212);
  auVar148 = vfmadd213ps_fma(auVar148,auVar76,auVar212);
  auVar148 = vsubps_avx(auVar148,auVar211);
  auVar211 = vfmadd231ps_fma(auVar211,auVar148,auVar76);
  auVar77._0_8_ = CONCAT44(auVar148._4_4_ * 3.0,auVar148._0_4_ * 3.0);
  auVar77._8_4_ = auVar148._8_4_ * 3.0;
  auVar77._12_4_ = auVar148._12_4_ * 3.0;
  auVar272._8_8_ = auVar211._0_8_;
  auVar272._0_8_ = auVar211._0_8_;
  auVar148 = vshufpd_avx(auVar211,auVar211,3);
  auVar211 = vshufps_avx(auVar244,auVar244,0x55);
  auVar66 = vsubps_avx(auVar148,auVar272);
  auVar22 = vfmadd231ps_fma(auVar272,auVar211,auVar66);
  auVar279._8_8_ = auVar77._0_8_;
  auVar279._0_8_ = auVar77._0_8_;
  auVar148 = vshufpd_avx(auVar77,auVar77,3);
  auVar148 = vsubps_avx(auVar148,auVar279);
  auVar242 = vfmadd213ps_fma(auVar148,auVar211,auVar279);
  auVar211 = vmovshdup_avx(auVar242);
  auVar280._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
  auVar280._8_4_ = auVar211._8_4_ ^ 0x80000000;
  auVar280._12_4_ = auVar211._12_4_ ^ 0x80000000;
  auVar212 = vmovshdup_avx(auVar66);
  auVar148 = vunpcklps_avx(auVar212,auVar280);
  auVar229 = vshufps_avx(auVar148,auVar280,4);
  auVar68 = vshufps_avx(auVar244,auVar244,0x54);
  auVar130._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
  auVar130._8_4_ = auVar66._8_4_ ^ 0x80000000;
  auVar130._12_4_ = auVar66._12_4_ ^ 0x80000000;
  auVar148 = vmovlhps_avx(auVar130,auVar242);
  auVar148 = vshufps_avx(auVar148,auVar242,8);
  auVar211 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar211._0_4_)),auVar212,auVar242);
  uVar56 = auVar211._0_4_;
  auVar78._4_4_ = uVar56;
  auVar78._0_4_ = uVar56;
  auVar78._8_4_ = uVar56;
  auVar78._12_4_ = uVar56;
  auVar211 = vdivps_avx(auVar229,auVar78);
  auVar212 = vdivps_avx(auVar148,auVar78);
  fVar87 = auVar22._0_4_;
  fVar123 = auVar211._0_4_;
  auVar148 = vshufps_avx(auVar22,auVar22,0x55);
  fVar85 = auVar212._0_4_;
  auVar79._0_4_ = fVar87 * fVar123 + auVar148._0_4_ * fVar85;
  auVar79._4_4_ = fVar87 * auVar211._4_4_ + auVar148._4_4_ * auVar212._4_4_;
  auVar79._8_4_ = fVar87 * auVar211._8_4_ + auVar148._8_4_ * auVar212._8_4_;
  auVar79._12_4_ = fVar87 * auVar211._12_4_ + auVar148._12_4_ * auVar212._12_4_;
  auVar93 = vsubps_avx(auVar68,auVar79);
  auVar68 = vmovshdup_avx(auVar211);
  auVar148 = vinsertps_avx(auVar235,auVar264,0x1c);
  auVar155._0_4_ = auVar68._0_4_ * auVar148._0_4_;
  auVar155._4_4_ = auVar68._4_4_ * auVar148._4_4_;
  auVar155._8_4_ = auVar68._8_4_ * auVar148._8_4_;
  auVar155._12_4_ = auVar68._12_4_ * auVar148._12_4_;
  auVar229 = vinsertps_avx(auVar220,auVar251,0x1c);
  auVar100._0_4_ = auVar229._0_4_ * auVar68._0_4_;
  auVar100._4_4_ = auVar229._4_4_ * auVar68._4_4_;
  auVar100._8_4_ = auVar229._8_4_ * auVar68._8_4_;
  auVar100._12_4_ = auVar229._12_4_ * auVar68._12_4_;
  auVar22 = vminps_avx(auVar155,auVar100);
  auVar242 = vmaxps_avx(auVar100,auVar155);
  auVar68 = vinsertps_avx(auVar264,auVar235,0x4c);
  auVar67 = vmovshdup_avx(auVar212);
  auVar66 = vinsertps_avx(auVar251,auVar220,0x4c);
  auVar252._0_4_ = auVar67._0_4_ * auVar68._0_4_;
  auVar252._4_4_ = auVar67._4_4_ * auVar68._4_4_;
  auVar252._8_4_ = auVar67._8_4_ * auVar68._8_4_;
  auVar252._12_4_ = auVar67._12_4_ * auVar68._12_4_;
  auVar236._0_4_ = auVar67._0_4_ * auVar66._0_4_;
  auVar236._4_4_ = auVar67._4_4_ * auVar66._4_4_;
  auVar236._8_4_ = auVar67._8_4_ * auVar66._8_4_;
  auVar236._12_4_ = auVar67._12_4_ * auVar66._12_4_;
  auVar67 = vminps_avx(auVar252,auVar236);
  auVar265._0_4_ = auVar22._0_4_ + auVar67._0_4_;
  auVar265._4_4_ = auVar22._4_4_ + auVar67._4_4_;
  auVar265._8_4_ = auVar22._8_4_ + auVar67._8_4_;
  auVar265._12_4_ = auVar22._12_4_ + auVar67._12_4_;
  auVar22 = vmaxps_avx(auVar236,auVar252);
  auVar101._0_4_ = auVar22._0_4_ + auVar242._0_4_;
  auVar101._4_4_ = auVar22._4_4_ + auVar242._4_4_;
  auVar101._8_4_ = auVar22._8_4_ + auVar242._8_4_;
  auVar101._12_4_ = auVar22._12_4_ + auVar242._12_4_;
  auVar237._8_8_ = 0x3f80000000000000;
  auVar237._0_8_ = 0x3f80000000000000;
  auVar242 = vsubps_avx(auVar237,auVar101);
  auVar22 = vsubps_avx(auVar237,auVar265);
  auVar67 = vsubps_avx(auVar250,auVar244);
  auVar126 = vsubps_avx(auVar154,auVar244);
  auVar116._0_4_ = fVar123 * auVar148._0_4_;
  auVar116._4_4_ = fVar123 * auVar148._4_4_;
  auVar116._8_4_ = fVar123 * auVar148._8_4_;
  auVar116._12_4_ = fVar123 * auVar148._12_4_;
  auVar266._0_4_ = fVar123 * auVar229._0_4_;
  auVar266._4_4_ = fVar123 * auVar229._4_4_;
  auVar266._8_4_ = fVar123 * auVar229._8_4_;
  auVar266._12_4_ = fVar123 * auVar229._12_4_;
  auVar229 = vminps_avx(auVar116,auVar266);
  auVar148 = vmaxps_avx(auVar266,auVar116);
  auVar156._0_4_ = fVar85 * auVar68._0_4_;
  auVar156._4_4_ = fVar85 * auVar68._4_4_;
  auVar156._8_4_ = fVar85 * auVar68._8_4_;
  auVar156._12_4_ = fVar85 * auVar68._12_4_;
  auVar221._0_4_ = fVar85 * auVar66._0_4_;
  auVar221._4_4_ = fVar85 * auVar66._4_4_;
  auVar221._8_4_ = fVar85 * auVar66._8_4_;
  auVar221._12_4_ = fVar85 * auVar66._12_4_;
  auVar68 = vminps_avx(auVar156,auVar221);
  auVar267._0_4_ = auVar229._0_4_ + auVar68._0_4_;
  auVar267._4_4_ = auVar229._4_4_ + auVar68._4_4_;
  auVar267._8_4_ = auVar229._8_4_ + auVar68._8_4_;
  auVar267._12_4_ = auVar229._12_4_ + auVar68._12_4_;
  fVar134 = auVar67._0_4_;
  auVar273._0_4_ = fVar134 * auVar242._0_4_;
  fVar260 = auVar67._4_4_;
  auVar273._4_4_ = fVar260 * auVar242._4_4_;
  fVar191 = auVar67._8_4_;
  auVar273._8_4_ = fVar191 * auVar242._8_4_;
  fVar192 = auVar67._12_4_;
  auVar273._12_4_ = fVar192 * auVar242._12_4_;
  auVar229 = vmaxps_avx(auVar221,auVar156);
  auVar222._0_4_ = fVar134 * auVar22._0_4_;
  auVar222._4_4_ = fVar260 * auVar22._4_4_;
  auVar222._8_4_ = fVar191 * auVar22._8_4_;
  auVar222._12_4_ = fVar192 * auVar22._12_4_;
  fVar87 = auVar126._0_4_;
  auVar102._0_4_ = fVar87 * auVar242._0_4_;
  fVar146 = auVar126._4_4_;
  auVar102._4_4_ = fVar146 * auVar242._4_4_;
  fVar61 = auVar126._8_4_;
  auVar102._8_4_ = fVar61 * auVar242._8_4_;
  fVar228 = auVar126._12_4_;
  auVar102._12_4_ = fVar228 * auVar242._12_4_;
  auVar238._0_4_ = fVar87 * auVar22._0_4_;
  auVar238._4_4_ = fVar146 * auVar22._4_4_;
  auVar238._8_4_ = fVar61 * auVar22._8_4_;
  auVar238._12_4_ = fVar228 * auVar22._12_4_;
  auVar117._0_4_ = auVar148._0_4_ + auVar229._0_4_;
  auVar117._4_4_ = auVar148._4_4_ + auVar229._4_4_;
  auVar117._8_4_ = auVar148._8_4_ + auVar229._8_4_;
  auVar117._12_4_ = auVar148._12_4_ + auVar229._12_4_;
  auVar157._8_8_ = 0x3f800000;
  auVar157._0_8_ = 0x3f800000;
  auVar148 = vsubps_avx(auVar157,auVar117);
  auVar229 = vsubps_avx(auVar157,auVar267);
  auVar268._0_4_ = fVar134 * auVar148._0_4_;
  auVar268._4_4_ = fVar260 * auVar148._4_4_;
  auVar268._8_4_ = fVar191 * auVar148._8_4_;
  auVar268._12_4_ = fVar192 * auVar148._12_4_;
  auVar253._0_4_ = fVar134 * auVar229._0_4_;
  auVar253._4_4_ = fVar260 * auVar229._4_4_;
  auVar253._8_4_ = fVar191 * auVar229._8_4_;
  auVar253._12_4_ = fVar192 * auVar229._12_4_;
  auVar118._0_4_ = fVar87 * auVar148._0_4_;
  auVar118._4_4_ = fVar146 * auVar148._4_4_;
  auVar118._8_4_ = fVar61 * auVar148._8_4_;
  auVar118._12_4_ = fVar228 * auVar148._12_4_;
  auVar158._0_4_ = fVar87 * auVar229._0_4_;
  auVar158._4_4_ = fVar146 * auVar229._4_4_;
  auVar158._8_4_ = fVar61 * auVar229._8_4_;
  auVar158._12_4_ = fVar228 * auVar229._12_4_;
  auVar148 = vminps_avx(auVar268,auVar253);
  auVar229 = vminps_avx(auVar118,auVar158);
  auVar148 = vminps_avx(auVar148,auVar229);
  auVar229 = vmaxps_avx(auVar253,auVar268);
  auVar68 = vmaxps_avx(auVar158,auVar118);
  auVar66 = vminps_avx(auVar273,auVar222);
  auVar242 = vminps_avx(auVar102,auVar238);
  auVar66 = vminps_avx(auVar66,auVar242);
  auVar148 = vhaddps_avx(auVar148,auVar66);
  auVar229 = vmaxps_avx(auVar68,auVar229);
  auVar68 = vmaxps_avx(auVar222,auVar273);
  auVar66 = vmaxps_avx(auVar238,auVar102);
  auVar68 = vmaxps_avx(auVar66,auVar68);
  auVar229 = vhaddps_avx(auVar229,auVar68);
  auVar148 = vshufps_avx(auVar148,auVar148,0xe8);
  auVar229 = vshufps_avx(auVar229,auVar229,0xe8);
  auVar239._0_4_ = auVar93._0_4_ + auVar148._0_4_;
  auVar239._4_4_ = auVar93._4_4_ + auVar148._4_4_;
  auVar239._8_4_ = auVar93._8_4_ + auVar148._8_4_;
  auVar239._12_4_ = auVar93._12_4_ + auVar148._12_4_;
  auVar223._0_4_ = auVar93._0_4_ + auVar229._0_4_;
  auVar223._4_4_ = auVar93._4_4_ + auVar229._4_4_;
  auVar223._8_4_ = auVar93._8_4_ + auVar229._8_4_;
  auVar223._12_4_ = auVar93._12_4_ + auVar229._12_4_;
  auVar226 = ZEXT1664(auVar223);
  auVar148 = vmaxps_avx(auVar250,auVar239);
  auVar229 = vminps_avx(auVar223,auVar154);
  auVar148 = vcmpps_avx(auVar229,auVar148,1);
  auVar148 = vshufps_avx(auVar148,auVar148,0x50);
  if ((auVar148 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar148[0xf] < '\0')
  goto LAB_0115d673;
  bVar52 = 0;
  if ((auVar190._0_4_ < auVar239._0_4_) && (bVar52 = 0, auVar223._0_4_ < auVar154._0_4_)) {
    auVar229 = vmovshdup_avx(auVar239);
    auVar148 = vcmpps_avx(auVar223,auVar154,1);
    bVar52 = auVar148[4] & auVar94._0_4_ < auVar229._0_4_;
  }
  auVar226 = ZEXT464(0x40400000);
  p03.field_0.i[0] = auVar65._0_4_;
  p03.field_0.i[1] = auVar65._4_4_;
  p03.field_0.i[2] = auVar65._8_4_;
  p03.field_0.i[3] = auVar65._12_4_;
  if (((3 < (uint)uVar58 || fVar86 < 0.001) | bVar52) == 1) {
    lVar51 = 0xc9;
    do {
      lVar51 = lVar51 + -1;
      if (lVar51 == 0) goto LAB_0115d673;
      fVar146 = auVar93._0_4_;
      fVar87 = 1.0 - fVar146;
      fVar86 = fVar87 * fVar87 * fVar87;
      fVar88 = fVar146 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar146 * fVar146 * 3.0;
      auVar142._4_4_ = fVar86;
      auVar142._0_4_ = fVar86;
      auVar142._8_4_ = fVar86;
      auVar142._12_4_ = fVar86;
      auVar119._4_4_ = fVar88;
      auVar119._0_4_ = fVar88;
      auVar119._8_4_ = fVar88;
      auVar119._12_4_ = fVar88;
      auVar103._4_4_ = fVar87;
      auVar103._0_4_ = fVar87;
      auVar103._8_4_ = fVar87;
      auVar103._12_4_ = fVar87;
      fVar146 = fVar146 * fVar146 * fVar146;
      auVar159._0_4_ = p03.field_0.v[0] * fVar146;
      auVar159._4_4_ = p03.field_0.v[1] * fVar146;
      auVar159._8_4_ = p03.field_0.v[2] * fVar146;
      auVar159._12_4_ = p03.field_0.v[3] * fVar146;
      auVar9 = vfmadd231ps_fma(auVar159,auVar15,auVar103);
      auVar9 = vfmadd231ps_fma(auVar9,auVar14,auVar119);
      auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar142);
      auVar104._8_8_ = auVar9._0_8_;
      auVar104._0_8_ = auVar9._0_8_;
      auVar9 = vshufpd_avx(auVar9,auVar9,3);
      auVar148 = vshufps_avx(auVar93,auVar93,0x55);
      auVar9 = vsubps_avx(auVar9,auVar104);
      auVar148 = vfmadd213ps_fma(auVar9,auVar148,auVar104);
      fVar86 = auVar148._0_4_;
      auVar9 = vshufps_avx(auVar148,auVar148,0x55);
      auVar105._0_4_ = fVar123 * fVar86 + fVar85 * auVar9._0_4_;
      auVar105._4_4_ = auVar211._4_4_ * fVar86 + auVar212._4_4_ * auVar9._4_4_;
      auVar105._8_4_ = auVar211._8_4_ * fVar86 + auVar212._8_4_ * auVar9._8_4_;
      auVar105._12_4_ = auVar211._12_4_ * fVar86 + auVar212._12_4_ * auVar9._12_4_;
      auVar93 = vsubps_avx(auVar93,auVar105);
      auVar9 = vandps_avx(local_428,auVar148);
      auVar148 = vshufps_avx(auVar9,auVar9,0xf5);
      auVar9 = vmaxss_avx(auVar148,auVar9);
    } while (fVar84 <= auVar9._0_4_);
    local_218 = auVar93._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar9 = vmovshdup_avx(auVar93);
      fVar86 = auVar9._0_4_;
      if ((0.0 <= fVar86) && (fVar86 <= 1.0)) {
        auVar9 = vinsertps_avx(ZEXT416((uint)(pLVar57->vx).field_0.m128[2]),
                               ZEXT416(*(uint *)((long)&(pLVar57->vy).field_0 + 8)),0x1c);
        auVar68 = vinsertps_avx(auVar9,ZEXT416(*(uint *)((long)&(pLVar57->vz).field_0 + 8)),0x28);
        auVar9 = vdpps_avx(auVar68,local_448,0x7f);
        auVar148 = vdpps_avx(auVar68,local_458,0x7f);
        auVar211 = vdpps_avx(auVar68,auVar64,0x7f);
        auVar212 = vdpps_avx(auVar68,auVar111,0x7f);
        auVar229 = vdpps_avx(auVar68,auVar91,0x7f);
        auVar250 = vdpps_avx(auVar68,auVar63,0x7f);
        auVar154 = vdpps_avx(auVar68,auVar92,0x7f);
        auVar68 = vdpps_avx(auVar68,auVar124,0x7f);
        fVar88 = 1.0 - fVar86;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar229._0_4_)),ZEXT416((uint)fVar88),
                                 auVar9);
        auVar148 = vfmadd231ss_fma(ZEXT416((uint)(auVar250._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                   auVar148);
        auVar211 = vfmadd231ss_fma(ZEXT416((uint)(auVar154._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                   auVar211);
        auVar226 = ZEXT1664(auVar211);
        auVar212 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar68._0_4_)),ZEXT416((uint)fVar88),
                                   auVar212);
        fVar85 = 1.0 - local_218;
        fVar86 = fVar85 * local_218 * local_218 * 3.0;
        fVar146 = local_218 * local_218 * local_218;
        auVar211 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ * fVar146)),ZEXT416((uint)fVar86),
                                   auVar211);
        fVar88 = local_218 * 3.0 * fVar85 * fVar85;
        auVar148 = vfmadd231ss_fma(auVar211,ZEXT416((uint)fVar88),auVar148);
        fVar123 = fVar85 * fVar85 * fVar85;
        auVar9 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar123),auVar9);
        fVar87 = auVar9._0_4_;
        if ((fVar60 <= fVar87) && (fVar61 = *(float *)(ray + k * 4 + 0x80), fVar87 <= fVar61)) {
          pGVar5 = (context->scene->geometries).items[uVar49].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar59 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar59 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_208 = vshufps_avx(auVar93,auVar93,0x55);
            auVar204._8_4_ = 0x3f800000;
            auVar204._0_8_ = 0x3f8000003f800000;
            auVar204._12_4_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar204,local_208);
            fVar228 = local_208._0_4_;
            auVar224._0_4_ = fVar228 * (float)local_478._0_4_;
            fVar134 = local_208._4_4_;
            auVar224._4_4_ = fVar134 * (float)local_478._4_4_;
            fVar260 = local_208._8_4_;
            auVar224._8_4_ = fVar260 * fStack_470;
            fVar191 = local_208._12_4_;
            auVar224._12_4_ = fVar191 * fStack_46c;
            auVar240._0_4_ = fVar228 * (float)local_4b8._0_4_;
            auVar240._4_4_ = fVar134 * (float)local_4b8._4_4_;
            auVar240._8_4_ = fVar260 * fStack_4b0;
            auVar240._12_4_ = fVar191 * fStack_4ac;
            auVar245._0_4_ = fVar228 * (float)local_4c8._0_4_;
            auVar245._4_4_ = fVar134 * (float)local_4c8._4_4_;
            auVar245._8_4_ = fVar260 * fStack_4c0;
            auVar245._12_4_ = fVar191 * fStack_4bc;
            auVar254._0_4_ = fVar228 * fVar162;
            auVar254._4_4_ = fVar134 * fVar178;
            auVar254._8_4_ = fVar260 * fVar179;
            auVar254._12_4_ = fVar191 * fVar180;
            auVar148 = vfmadd231ps_fma(auVar224,auVar9,local_468);
            auVar211 = vfmadd231ps_fma(auVar240,auVar9,local_498);
            auVar212 = vfmadd231ps_fma(auVar245,auVar9,local_4a8);
            auVar229 = vfmadd231ps_fma(auVar254,auVar9,local_488);
            auVar9 = vsubps_avx(auVar211,auVar148);
            auVar148 = vsubps_avx(auVar212,auVar211);
            auVar226 = ZEXT1664(auVar148);
            auVar211 = vsubps_avx(auVar229,auVar212);
            auVar246._0_4_ = auVar148._0_4_ * local_218;
            auVar246._4_4_ = auVar148._4_4_ * local_218;
            auVar246._8_4_ = auVar148._8_4_ * local_218;
            auVar246._12_4_ = auVar148._12_4_ * local_218;
            auVar176._4_4_ = fVar85;
            auVar176._0_4_ = fVar85;
            auVar176._8_4_ = fVar85;
            auVar176._12_4_ = fVar85;
            auVar9 = vfmadd231ps_fma(auVar246,auVar176,auVar9);
            auVar205._0_4_ = auVar211._0_4_ * local_218;
            auVar205._4_4_ = auVar211._4_4_ * local_218;
            auVar205._8_4_ = auVar211._8_4_ * local_218;
            auVar205._12_4_ = auVar211._12_4_ * local_218;
            auVar211 = vfmadd231ps_fma(auVar205,auVar176,auVar148);
            auVar206._0_4_ = auVar211._0_4_ * local_218;
            auVar206._4_4_ = auVar211._4_4_ * local_218;
            auVar206._8_4_ = auVar211._8_4_ * local_218;
            auVar206._12_4_ = auVar211._12_4_ * local_218;
            auVar211 = vfmadd231ps_fma(auVar206,auVar176,auVar9);
            local_398 = auVar147._0_4_;
            fStack_394 = auVar147._4_4_;
            fStack_390 = auVar147._8_4_;
            fStack_38c = auVar147._12_4_;
            auVar160._0_4_ = fVar146 * local_398;
            auVar160._4_4_ = fVar146 * fStack_394;
            auVar160._8_4_ = fVar146 * fStack_390;
            auVar160._12_4_ = fVar146 * fStack_38c;
            auVar120._4_4_ = fVar86;
            auVar120._0_4_ = fVar86;
            auVar120._8_4_ = fVar86;
            auVar120._12_4_ = fVar86;
            auVar9 = vfmadd132ps_fma(auVar120,auVar160,auVar136);
            auVar143._4_4_ = fVar88;
            auVar143._0_4_ = fVar88;
            auVar143._8_4_ = fVar88;
            auVar143._12_4_ = fVar88;
            auVar9 = vfmadd132ps_fma(auVar143,auVar9,auVar90);
            auVar121._0_4_ = auVar211._0_4_ * 3.0;
            auVar121._4_4_ = auVar211._4_4_ * 3.0;
            auVar121._8_4_ = auVar211._8_4_ * 3.0;
            auVar121._12_4_ = auVar211._12_4_ * 3.0;
            auVar131._4_4_ = fVar123;
            auVar131._0_4_ = fVar123;
            auVar131._8_4_ = fVar123;
            auVar131._12_4_ = fVar123;
            auVar211 = vfmadd132ps_fma(auVar131,auVar9,auVar62);
            auVar9 = vshufps_avx(auVar121,auVar121,0xc9);
            auVar144._0_4_ = auVar211._0_4_ * auVar9._0_4_;
            auVar144._4_4_ = auVar211._4_4_ * auVar9._4_4_;
            auVar144._8_4_ = auVar211._8_4_ * auVar9._8_4_;
            auVar144._12_4_ = auVar211._12_4_ * auVar9._12_4_;
            auVar9 = vshufps_avx(auVar211,auVar211,0xc9);
            auVar211 = vfmsub231ps_fma(auVar144,auVar121,auVar9);
            auVar9 = vshufps_avx(auVar211,auVar211,0x55);
            local_248[0] = (RTCHitN)auVar9[0];
            local_248[1] = (RTCHitN)auVar9[1];
            local_248[2] = (RTCHitN)auVar9[2];
            local_248[3] = (RTCHitN)auVar9[3];
            local_248[4] = (RTCHitN)auVar9[4];
            local_248[5] = (RTCHitN)auVar9[5];
            local_248[6] = (RTCHitN)auVar9[6];
            local_248[7] = (RTCHitN)auVar9[7];
            local_248[8] = (RTCHitN)auVar9[8];
            local_248[9] = (RTCHitN)auVar9[9];
            local_248[10] = (RTCHitN)auVar9[10];
            local_248[0xb] = (RTCHitN)auVar9[0xb];
            local_248[0xc] = (RTCHitN)auVar9[0xc];
            local_248[0xd] = (RTCHitN)auVar9[0xd];
            local_248[0xe] = (RTCHitN)auVar9[0xe];
            local_248[0xf] = (RTCHitN)auVar9[0xf];
            local_238 = vshufps_avx(auVar211,auVar211,0xaa);
            local_228 = auVar211._0_4_;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_1f8 = CONCAT44(uVar4,uVar4);
            uStack_1f0 = CONCAT44(uVar4,uVar4);
            local_1e8._4_4_ = uVar49;
            local_1e8._0_4_ = uVar49;
            local_1e8._8_4_ = uVar49;
            local_1e8._12_4_ = uVar49;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar87;
            local_528 = *local_518;
            args.valid = (int *)local_528;
            args.geometryUserPtr = pGVar5->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_248;
            args.N = 4;
            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar226 = ZEXT1664(auVar148);
              (*pGVar5->occlusionFilterN)(&args);
            }
            if (local_528 == (undefined1  [16])0x0) {
              auVar9 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar9 = auVar9 ^ _DAT_01f46b70;
            }
            else {
              p_Var8 = context->args->filter;
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar226 = ZEXT1664(auVar226._0_16_);
                (*p_Var8)(&args);
              }
              auVar148 = vpcmpeqd_avx(local_528,_DAT_01f45a50);
              auVar9 = auVar148 ^ _DAT_01f46b70;
              auVar122._8_4_ = 0xff800000;
              auVar122._0_8_ = 0xff800000ff800000;
              auVar122._12_4_ = 0xff800000;
              auVar148 = vblendvps_avx(auVar122,*(undefined1 (*) [16])(args.ray + 0x80),auVar148);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar148;
            }
            auVar106._8_8_ = 0x100000001;
            auVar106._0_8_ = 0x100000001;
            bVar59 = (auVar106 & auVar9) != (undefined1  [16])0x0;
            if (!bVar59) {
              *(float *)(ray + k * 4 + 0x80) = fVar61;
            }
          }
          bVar55 = (bool)(bVar55 | bVar59);
          pLVar57 = local_510;
        }
      }
    }
    goto LAB_0115d673;
  }
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)fVar88),0x10);
  auVar68 = vinsertps_avx(auVar94,ZEXT416((uint)auVar95._0_4_),0x10);
  goto LAB_0115d0c3;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }